

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  ulong uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  byte bVar75;
  byte bVar76;
  byte bVar77;
  ulong uVar78;
  byte bVar79;
  ulong uVar80;
  long lVar81;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  Primitive *pPVar82;
  bool bVar83;
  bool bVar84;
  ulong uVar85;
  uint uVar86;
  uint uVar137;
  uint uVar138;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar139;
  uint uVar143;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float pp;
  float fVar144;
  float fVar145;
  undefined4 uVar146;
  float fVar162;
  float fVar163;
  undefined1 auVar147 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar148 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar182;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar183;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar206;
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar220;
  float fVar221;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar232;
  undefined1 auVar230 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [64];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  float fVar242;
  float fVar243;
  undefined1 auVar240 [16];
  float fVar244;
  undefined1 auVar241 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [16];
  float fVar249;
  undefined1 auVar247 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_918;
  undefined2 local_912;
  RayQueryContext *local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [16];
  undefined4 local_88c;
  uint local_888;
  int local_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined8 local_5f0;
  undefined4 local_5e8;
  float local_5e4;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 local_5d8;
  uint local_5d4;
  uint local_5d0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  Primitive *local_458;
  Primitive *local_450;
  ulong local_448;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 auStack_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_370 [16];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar126 [32];
  undefined1 auVar248 [64];
  
  PVar5 = prim[1];
  uVar80 = (ulong)(byte)PVar5;
  lVar81 = uVar80 * 0x19;
  fVar207 = *(float *)(prim + lVar81 + 0x12);
  auVar92 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar81 + 6));
  fVar206 = fVar207 * auVar92._0_4_;
  fVar144 = fVar207 * (ray->dir).field_0.m128[0];
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar80 * 4 + 6);
  auVar100 = vpmovsxbd_avx2(auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar80 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar90);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar80 * 6 + 6);
  auVar101 = vpmovsxbd_avx2(auVar94);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar80 * 0xb + 6);
  auVar102 = vpmovsxbd_avx2(auVar93);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar107 = vpmovsxbd_avx2(auVar87);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar103 = vcvtdq2ps_avx(auVar107);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar80 + 6);
  auVar99 = vpmovsxbd_avx2(auVar91);
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar78 = (ulong)(uint)((int)(uVar80 * 9) * 2);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar104 = vpmovsxbd_avx2(auVar88);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar246._8_8_ = 0;
  auVar246._0_8_ = *(ulong *)(prim + uVar78 + uVar80 + 6);
  auVar105 = vpmovsxbd_avx2(auVar246);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar252 = ZEXT3264(auVar105);
  uVar85 = (ulong)(uint)((int)(uVar80 * 5) << 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar85 + 6);
  auVar97 = vpmovsxbd_avx2(auVar4);
  auVar106 = vcvtdq2ps_avx(auVar97);
  auVar255 = ZEXT3264(auVar106);
  auVar118._4_4_ = fVar144;
  auVar118._0_4_ = fVar144;
  auVar118._8_4_ = fVar144;
  auVar118._12_4_ = fVar144;
  auVar118._16_4_ = fVar144;
  auVar118._20_4_ = fVar144;
  auVar118._24_4_ = fVar144;
  auVar118._28_4_ = fVar144;
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar109 = ZEXT1632(CONCAT412(fVar207 * (ray->dir).field_0.m128[3],
                                CONCAT48(fVar207 * (ray->dir).field_0.m128[2],
                                         CONCAT44(fVar207 * (ray->dir).field_0.m128[1],fVar144))));
  auVar108 = vpermps_avx2(auVar120,auVar109);
  auVar96 = vpermps_avx512vl(auVar95,auVar109);
  fVar144 = auVar96._0_4_;
  fVar242 = auVar96._4_4_;
  auVar109._4_4_ = fVar242 * auVar101._4_4_;
  auVar109._0_4_ = fVar144 * auVar101._0_4_;
  fVar243 = auVar96._8_4_;
  auVar109._8_4_ = fVar243 * auVar101._8_4_;
  fVar244 = auVar96._12_4_;
  auVar109._12_4_ = fVar244 * auVar101._12_4_;
  fVar220 = auVar96._16_4_;
  auVar109._16_4_ = fVar220 * auVar101._16_4_;
  fVar221 = auVar96._20_4_;
  auVar109._20_4_ = fVar221 * auVar101._20_4_;
  fVar167 = auVar96._24_4_;
  auVar109._24_4_ = fVar167 * auVar101._24_4_;
  auVar109._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = auVar99._4_4_ * fVar242;
  auVar107._0_4_ = auVar99._0_4_ * fVar144;
  auVar107._8_4_ = auVar99._8_4_ * fVar243;
  auVar107._12_4_ = auVar99._12_4_ * fVar244;
  auVar107._16_4_ = auVar99._16_4_ * fVar220;
  auVar107._20_4_ = auVar99._20_4_ * fVar221;
  auVar107._24_4_ = auVar99._24_4_ * fVar167;
  auVar107._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar106._4_4_ * fVar242;
  auVar97._0_4_ = auVar106._0_4_ * fVar144;
  auVar97._8_4_ = auVar106._8_4_ * fVar243;
  auVar97._12_4_ = auVar106._12_4_ * fVar244;
  auVar97._16_4_ = auVar106._16_4_ * fVar220;
  auVar97._20_4_ = auVar106._20_4_ * fVar221;
  auVar97._24_4_ = auVar106._24_4_ * fVar167;
  auVar97._28_4_ = auVar96._28_4_;
  auVar89 = vfmadd231ps_fma(auVar109,auVar108,auVar98);
  auVar90 = vfmadd231ps_fma(auVar107,auVar108,auVar103);
  auVar94 = vfmadd231ps_fma(auVar97,auVar105,auVar108);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar118,auVar100);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar118,auVar102);
  auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar104,auVar118);
  auVar119._4_4_ = fVar206;
  auVar119._0_4_ = fVar206;
  auVar119._8_4_ = fVar206;
  auVar119._12_4_ = fVar206;
  auVar119._16_4_ = fVar206;
  auVar119._20_4_ = fVar206;
  auVar119._24_4_ = fVar206;
  auVar119._28_4_ = fVar206;
  auVar97 = ZEXT1632(CONCAT412(fVar207 * auVar92._12_4_,
                               CONCAT48(fVar207 * auVar92._8_4_,
                                        CONCAT44(fVar207 * auVar92._4_4_,fVar206))));
  auVar107 = vpermps_avx2(auVar120,auVar97);
  auVar97 = vpermps_avx512vl(auVar95,auVar97);
  fVar207 = auVar97._0_4_;
  fVar144 = auVar97._4_4_;
  auVar108._4_4_ = fVar144 * auVar101._4_4_;
  auVar108._0_4_ = fVar207 * auVar101._0_4_;
  fVar242 = auVar97._8_4_;
  auVar108._8_4_ = fVar242 * auVar101._8_4_;
  fVar243 = auVar97._12_4_;
  auVar108._12_4_ = fVar243 * auVar101._12_4_;
  fVar244 = auVar97._16_4_;
  auVar108._16_4_ = fVar244 * auVar101._16_4_;
  fVar220 = auVar97._20_4_;
  auVar108._20_4_ = fVar220 * auVar101._20_4_;
  fVar221 = auVar97._24_4_;
  auVar108._24_4_ = fVar221 * auVar101._24_4_;
  auVar108._28_4_ = 1;
  auVar95._4_4_ = auVar99._4_4_ * fVar144;
  auVar95._0_4_ = auVar99._0_4_ * fVar207;
  auVar95._8_4_ = auVar99._8_4_ * fVar242;
  auVar95._12_4_ = auVar99._12_4_ * fVar243;
  auVar95._16_4_ = auVar99._16_4_ * fVar244;
  auVar95._20_4_ = auVar99._20_4_ * fVar220;
  auVar95._24_4_ = auVar99._24_4_ * fVar221;
  auVar95._28_4_ = auVar101._28_4_;
  auVar99._4_4_ = auVar106._4_4_ * fVar144;
  auVar99._0_4_ = auVar106._0_4_ * fVar207;
  auVar99._8_4_ = auVar106._8_4_ * fVar242;
  auVar99._12_4_ = auVar106._12_4_ * fVar243;
  auVar99._16_4_ = auVar106._16_4_ * fVar244;
  auVar99._20_4_ = auVar106._20_4_ * fVar220;
  auVar99._24_4_ = auVar106._24_4_ * fVar221;
  auVar99._28_4_ = auVar97._28_4_;
  auVar93 = vfmadd231ps_fma(auVar108,auVar107,auVar98);
  auVar87 = vfmadd231ps_fma(auVar95,auVar107,auVar103);
  auVar91 = vfmadd231ps_fma(auVar99,auVar107,auVar105);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar119,auVar100);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar119,auVar102);
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar119,auVar104);
  auVar100 = vandps_avx(ZEXT1632(auVar89),auVar114);
  auVar117._8_4_ = 0x219392ef;
  auVar117._0_8_ = 0x219392ef219392ef;
  auVar117._12_4_ = 0x219392ef;
  auVar117._16_4_ = 0x219392ef;
  auVar117._20_4_ = 0x219392ef;
  auVar117._24_4_ = 0x219392ef;
  auVar117._28_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar100,auVar117,1);
  bVar83 = (bool)((byte)uVar78 & 1);
  auVar96._0_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar89._0_4_;
  bVar83 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar89._4_4_;
  bVar83 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar89._8_4_;
  bVar83 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar89._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar90),auVar114);
  uVar78 = vcmpps_avx512vl(auVar100,auVar117,1);
  bVar83 = (bool)((byte)uVar78 & 1);
  auVar110._0_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar90._0_4_;
  bVar83 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar90._4_4_;
  bVar83 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar90._8_4_;
  bVar83 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar90._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(ZEXT1632(auVar94),auVar114);
  uVar78 = vcmpps_avx512vl(auVar100,auVar117,1);
  bVar83 = (bool)((byte)uVar78 & 1);
  auVar100._0_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar94._0_4_;
  bVar83 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar94._4_4_;
  bVar83 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar94._8_4_;
  bVar83 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar83 * 0x219392ef | (uint)!bVar83 * auVar94._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar98 = vrcp14ps_avx512vl(auVar96);
  auVar116._8_4_ = 0x3f800000;
  auVar116._0_8_ = 0x3f8000003f800000;
  auVar116._12_4_ = 0x3f800000;
  auVar116._16_4_ = 0x3f800000;
  auVar116._20_4_ = 0x3f800000;
  auVar116._24_4_ = 0x3f800000;
  auVar116._28_4_ = 0x3f800000;
  auVar89 = vfnmadd213ps_fma(auVar96,auVar98,auVar116);
  auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar110);
  auVar90 = vfnmadd213ps_fma(auVar110,auVar98,auVar116);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar100);
  auVar94 = vfnmadd213ps_fma(auVar100,auVar98,auVar116);
  auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar98,auVar98);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 7 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar93));
  auVar104._4_4_ = auVar89._4_4_ * auVar100._4_4_;
  auVar104._0_4_ = auVar89._0_4_ * auVar100._0_4_;
  auVar104._8_4_ = auVar89._8_4_ * auVar100._8_4_;
  auVar104._12_4_ = auVar89._12_4_ * auVar100._12_4_;
  auVar104._16_4_ = auVar100._16_4_ * 0.0;
  auVar104._20_4_ = auVar100._20_4_ * 0.0;
  auVar104._24_4_ = auVar100._24_4_ * 0.0;
  auVar104._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 9 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar93));
  auVar99 = vpbroadcastd_avx512vl();
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar113._0_4_ = auVar89._0_4_ * auVar100._0_4_;
  auVar113._4_4_ = auVar89._4_4_ * auVar100._4_4_;
  auVar113._8_4_ = auVar89._8_4_ * auVar100._8_4_;
  auVar113._12_4_ = auVar89._12_4_ * auVar100._12_4_;
  auVar113._16_4_ = auVar100._16_4_ * 0.0;
  auVar113._20_4_ = auVar100._20_4_ * 0.0;
  auVar113._24_4_ = auVar100._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar5 * 0x10 + uVar80 * -2 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar87));
  auVar105._4_4_ = auVar90._4_4_ * auVar100._4_4_;
  auVar105._0_4_ = auVar90._0_4_ * auVar100._0_4_;
  auVar105._8_4_ = auVar90._8_4_ * auVar100._8_4_;
  auVar105._12_4_ = auVar90._12_4_ * auVar100._12_4_;
  auVar105._16_4_ = auVar100._16_4_ * 0.0;
  auVar105._20_4_ = auVar100._20_4_ * 0.0;
  auVar105._24_4_ = auVar100._24_4_ * 0.0;
  auVar105._28_4_ = auVar100._28_4_;
  auVar100 = vcvtdq2ps_avx(auVar98);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar87));
  auVar112._0_4_ = auVar90._0_4_ * auVar100._0_4_;
  auVar112._4_4_ = auVar90._4_4_ * auVar100._4_4_;
  auVar112._8_4_ = auVar90._8_4_ * auVar100._8_4_;
  auVar112._12_4_ = auVar90._12_4_ * auVar100._12_4_;
  auVar112._16_4_ = auVar100._16_4_ * 0.0;
  auVar112._20_4_ = auVar100._20_4_ * 0.0;
  auVar112._24_4_ = auVar100._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 + uVar80 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar91));
  auVar106._4_4_ = auVar100._4_4_ * auVar94._4_4_;
  auVar106._0_4_ = auVar100._0_4_ * auVar94._0_4_;
  auVar106._8_4_ = auVar100._8_4_ * auVar94._8_4_;
  auVar106._12_4_ = auVar100._12_4_ * auVar94._12_4_;
  auVar106._16_4_ = auVar100._16_4_ * 0.0;
  auVar106._20_4_ = auVar100._20_4_ * 0.0;
  auVar106._24_4_ = auVar100._24_4_ * 0.0;
  auVar106._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0x17 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar91));
  auVar111._0_4_ = auVar94._0_4_ * auVar100._0_4_;
  auVar111._4_4_ = auVar94._4_4_ * auVar100._4_4_;
  auVar111._8_4_ = auVar94._8_4_ * auVar100._8_4_;
  auVar111._12_4_ = auVar94._12_4_ * auVar100._12_4_;
  auVar111._16_4_ = auVar100._16_4_ * 0.0;
  auVar111._20_4_ = auVar100._20_4_ * 0.0;
  auVar111._24_4_ = auVar100._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar100 = vpminsd_avx2(auVar104,auVar113);
  auVar98 = vpminsd_avx2(auVar105,auVar112);
  auVar100 = vmaxps_avx(auVar100,auVar98);
  auVar98 = vpminsd_avx2(auVar106,auVar111);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar101._4_4_ = uVar1;
  auVar101._0_4_ = uVar1;
  auVar101._8_4_ = uVar1;
  auVar101._12_4_ = uVar1;
  auVar101._16_4_ = uVar1;
  auVar101._20_4_ = uVar1;
  auVar101._24_4_ = uVar1;
  auVar101._28_4_ = uVar1;
  auVar98 = vmaxps_avx512vl(auVar98,auVar101);
  auVar100 = vmaxps_avx(auVar100,auVar98);
  auVar98._8_4_ = 0x3f7ffffa;
  auVar98._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar98._12_4_ = 0x3f7ffffa;
  auVar98._16_4_ = 0x3f7ffffa;
  auVar98._20_4_ = 0x3f7ffffa;
  auVar98._24_4_ = 0x3f7ffffa;
  auVar98._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar100,auVar98);
  auVar100 = vpmaxsd_avx2(auVar104,auVar113);
  auVar98 = vpmaxsd_avx2(auVar105,auVar112);
  auVar100 = vminps_avx(auVar100,auVar98);
  auVar98 = vpmaxsd_avx2(auVar106,auVar111);
  fVar207 = ray->tfar;
  auVar102._4_4_ = fVar207;
  auVar102._0_4_ = fVar207;
  auVar102._8_4_ = fVar207;
  auVar102._12_4_ = fVar207;
  auVar102._16_4_ = fVar207;
  auVar102._20_4_ = fVar207;
  auVar102._24_4_ = fVar207;
  auVar102._28_4_ = fVar207;
  auVar98 = vminps_avx512vl(auVar98,auVar102);
  auVar100 = vminps_avx(auVar100,auVar98);
  auVar103._8_4_ = 0x3f800003;
  auVar103._0_8_ = 0x3f8000033f800003;
  auVar103._12_4_ = 0x3f800003;
  auVar103._16_4_ = 0x3f800003;
  auVar103._20_4_ = 0x3f800003;
  auVar103._24_4_ = 0x3f800003;
  auVar103._28_4_ = 0x3f800003;
  auVar100 = vmulps_avx512vl(auVar100,auVar103);
  uVar20 = vpcmpgtd_avx512vl(auVar99,_DAT_01fe9900);
  uVar18 = vcmpps_avx512vl(local_280,auVar100,2);
  if ((byte)((byte)uVar18 & (byte)uVar20) == 0) {
    return false;
  }
  local_910 = context;
  local_448 = (ulong)(byte)((byte)uVar18 & (byte)uVar20);
  pPVar82 = prim + lVar81 + 0x16;
  local_450 = prim;
  local_458 = pPVar82;
LAB_01ca1368:
  lVar81 = 0;
  for (uVar78 = local_448; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar81 = lVar81 + 1;
  }
  local_448 = local_448 - 1 & local_448;
  uVar1 = *(undefined4 *)(prim + lVar81 * 4 + 6);
  uVar78 = (ulong)(uint)((int)lVar81 << 6);
  auVar89 = *(undefined1 (*) [16])(pPVar82 + uVar78);
  if (local_448 != 0) {
    uVar80 = local_448 - 1 & local_448;
    for (uVar85 = local_448; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
    }
    if (uVar80 != 0) {
      for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar90 = *(undefined1 (*) [16])(pPVar82 + uVar78 + 0x10);
  auVar94 = *(undefined1 (*) [16])(pPVar82 + uVar78 + 0x20);
  auVar93 = *(undefined1 (*) [16])(pPVar82 + uVar78 + 0x30);
  auVar226._0_4_ = auVar89._0_4_ + auVar90._0_4_ + auVar94._0_4_ + auVar93._0_4_;
  auVar226._4_4_ = auVar89._4_4_ + auVar90._4_4_ + auVar94._4_4_ + auVar93._4_4_;
  auVar226._8_4_ = auVar89._8_4_ + auVar90._8_4_ + auVar94._8_4_ + auVar93._8_4_;
  auVar226._12_4_ = auVar89._12_4_ + auVar90._12_4_ + auVar94._12_4_ + auVar93._12_4_;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar92._8_4_ = 0x3e800000;
  auVar92._0_8_ = 0x3e8000003e800000;
  auVar92._12_4_ = 0x3e800000;
  auVar87 = vmulps_avx512vl(auVar226,auVar92);
  auVar87 = vsubps_avx(auVar87,(undefined1  [16])aVar2);
  auVar87 = vdpps_avx(auVar87,(undefined1  [16])aVar3,0x7f);
  local_908 = (ulong)*(uint *)(prim + 2);
  auVar91 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar246 = ZEXT816(0) << 0x40;
  auVar248 = ZEXT1664(auVar246);
  auVar240._4_12_ = ZEXT812(0) << 0x20;
  auVar240._0_4_ = auVar91._0_4_;
  auVar88 = vrcp14ss_avx512f(auVar246,auVar240);
  auVar91 = vfnmadd213ss_fma(auVar88,auVar91,ZEXT416(0x40000000));
  fVar207 = auVar87._0_4_ * auVar88._0_4_ * auVar91._0_4_;
  local_4c0 = ZEXT416((uint)fVar207);
  auVar227._4_4_ = fVar207;
  auVar227._0_4_ = fVar207;
  auVar227._8_4_ = fVar207;
  auVar227._12_4_ = fVar207;
  fStack_8d0 = fVar207;
  _local_8e0 = auVar227;
  fStack_8cc = fVar207;
  fStack_8c8 = fVar207;
  fStack_8c4 = fVar207;
  auVar87 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar227);
  auVar87 = vblendps_avx(auVar87,auVar246,8);
  auVar231 = ZEXT1664(auVar87);
  auVar89 = vsubps_avx(auVar89,auVar87);
  auVar94 = vsubps_avx(auVar94,auVar87);
  auVar239 = ZEXT1664(auVar94);
  uVar146 = *(undefined4 *)&(ray->dir).field_0;
  local_340._4_4_ = uVar146;
  local_340._0_4_ = uVar146;
  local_340._8_4_ = uVar146;
  local_340._12_4_ = uVar146;
  local_340._16_4_ = uVar146;
  local_340._20_4_ = uVar146;
  local_340._24_4_ = uVar146;
  local_340._28_4_ = uVar146;
  auVar245 = ZEXT3264(local_340);
  local_640 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar265 = ZEXT3264(local_640);
  local_3c0 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  auVar90 = vsubps_avx(auVar90,auVar87);
  auVar241 = ZEXT1664(auVar90);
  auVar93 = vsubps_avx(auVar93,auVar87);
  local_7e0 = vbroadcastss_avx512vl(auVar89);
  auVar263 = ZEXT3264(local_7e0);
  auVar122._8_4_ = 1;
  auVar122._0_8_ = 0x100000001;
  auVar122._12_4_ = 1;
  auVar122._16_4_ = 1;
  auVar122._20_4_ = 1;
  auVar122._24_4_ = 1;
  auVar122._28_4_ = 1;
  local_520 = ZEXT1632(auVar89);
  local_800 = vpermps_avx512vl(auVar122,local_520);
  auVar257 = ZEXT3264(local_800);
  auVar125._8_4_ = 2;
  auVar125._0_8_ = 0x200000002;
  auVar125._12_4_ = 2;
  auVar125._16_4_ = 2;
  auVar125._20_4_ = 2;
  auVar125._24_4_ = 2;
  auVar125._28_4_ = 2;
  local_6a0 = vpermps_avx512vl(auVar125,local_520);
  auVar258 = ZEXT3264(local_6a0);
  auVar126._8_4_ = 3;
  auVar126._0_8_ = 0x300000003;
  auVar126._12_4_ = 3;
  auVar126._16_4_ = 3;
  auVar126._20_4_ = 3;
  auVar126._24_4_ = 3;
  auVar126._28_4_ = 3;
  local_6c0 = vpermps_avx512vl(auVar126,local_520);
  auVar259 = ZEXT3264(local_6c0);
  local_820 = vbroadcastss_avx512vl(auVar90);
  auVar260 = ZEXT3264(local_820);
  local_560 = ZEXT1632(auVar90);
  local_6e0 = vpermps_avx512vl(auVar122,local_560);
  auVar261 = ZEXT3264(local_6e0);
  local_840 = vpermps_avx512vl(auVar125,local_560);
  auVar262 = ZEXT3264(local_840);
  local_700 = vpermps_avx512vl(auVar126,local_560);
  auVar264 = ZEXT3264(local_700);
  local_860 = vbroadcastss_avx512vl(auVar94);
  auVar266 = ZEXT3264(local_860);
  local_540 = ZEXT1632(auVar94);
  local_720 = vpermps_avx512vl(auVar122,local_540);
  auVar267 = ZEXT3264(local_720);
  local_740 = vpermps_avx512vl(auVar125,local_540);
  auVar268 = ZEXT3264(local_740);
  local_7c0 = vpermps_avx512vl(auVar126,local_540);
  auVar269 = ZEXT3264(local_7c0);
  local_880 = vbroadcastss_avx512vl(auVar93);
  auVar270 = ZEXT3264(local_880);
  _local_580 = ZEXT1632(auVar93);
  _local_1e0 = vpermps_avx2(auVar122,_local_580);
  local_240 = vpermps_avx512vl(auVar125,_local_580);
  local_260 = vpermps_avx2(auVar126,_local_580);
  auVar100 = vpermps_avx2(auVar125,ZEXT1632(CONCAT412(aVar3.field_3.w * aVar3.field_3.w,
                                                      CONCAT48(aVar3.z * aVar3.z,
                                                               CONCAT44(aVar3.y * aVar3.y,
                                                                        aVar3.x * aVar3.x)))));
  local_220 = vfmadd231ps_avx512vl(auVar100,local_640,local_640);
  auVar89 = vfmadd231ps_fma(local_220,local_340,local_340);
  local_200 = ZEXT1632(auVar89);
  auVar121._8_4_ = 0x7fffffff;
  auVar121._0_8_ = 0x7fffffff7fffffff;
  auVar121._12_4_ = 0x7fffffff;
  auVar121._16_4_ = 0x7fffffff;
  auVar121._20_4_ = 0x7fffffff;
  auVar121._24_4_ = 0x7fffffff;
  auVar121._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar89),auVar121);
  local_884 = 1;
  uVar78 = 0;
  bVar83 = false;
  local_370 = ZEXT816(0x3f80000000000000);
  auVar234 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  do {
    auVar89 = vmovshdup_avx(local_370);
    auVar89 = vsubps_avx(auVar89,local_370);
    auVar147._0_4_ = auVar89._0_4_;
    fVar17 = auVar147._0_4_ * 0.04761905;
    uVar146 = local_370._0_4_;
    local_620._4_4_ = uVar146;
    local_620._0_4_ = uVar146;
    local_620._8_4_ = uVar146;
    local_620._12_4_ = uVar146;
    local_620._16_4_ = uVar146;
    local_620._20_4_ = uVar146;
    local_620._24_4_ = uVar146;
    local_620._28_4_ = uVar146;
    auVar147._4_4_ = auVar147._0_4_;
    auVar147._8_4_ = auVar147._0_4_;
    auVar147._12_4_ = auVar147._0_4_;
    local_7a0._16_4_ = auVar147._0_4_;
    local_7a0._0_16_ = auVar147;
    local_7a0._20_4_ = auVar147._0_4_;
    local_7a0._24_4_ = auVar147._0_4_;
    local_7a0._28_4_ = auVar147._0_4_;
    auVar89 = vfmadd231ps_fma(local_620,local_7a0,_DAT_01faff20);
    auVar100 = vsubps_avx(auVar234._0_32_,ZEXT1632(auVar89));
    fVar144 = auVar100._0_4_;
    fVar243 = auVar100._4_4_;
    fVar220 = auVar100._8_4_;
    fVar167 = auVar100._12_4_;
    fVar183 = auVar100._16_4_;
    fVar15 = auVar100._20_4_;
    fVar16 = auVar100._24_4_;
    fVar145 = fVar144 * fVar144 * fVar144;
    fVar162 = fVar243 * fVar243 * fVar243;
    auVar39._4_4_ = fVar162;
    auVar39._0_4_ = fVar145;
    fVar163 = fVar220 * fVar220 * fVar220;
    auVar39._8_4_ = fVar163;
    fVar164 = fVar167 * fVar167 * fVar167;
    auVar39._12_4_ = fVar164;
    fVar165 = fVar183 * fVar183 * fVar183;
    auVar39._16_4_ = fVar165;
    fVar166 = fVar15 * fVar15 * fVar15;
    auVar39._20_4_ = fVar166;
    fVar168 = fVar16 * fVar16 * fVar16;
    auVar39._24_4_ = fVar168;
    auVar39._28_4_ = auVar147._0_4_;
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar101 = vmulps_avx512vl(auVar39,auVar98);
    fVar242 = auVar89._0_4_;
    fVar244 = auVar89._4_4_;
    fVar221 = auVar89._8_4_;
    fVar206 = auVar89._12_4_;
    fVar182 = fVar242 * fVar242 * fVar242;
    fVar203 = fVar244 * fVar244 * fVar244;
    fVar204 = fVar221 * fVar221 * fVar221;
    fVar205 = fVar206 * fVar206 * fVar206;
    auVar234._0_4_ = fVar242 * fVar144;
    auVar234._4_4_ = fVar244 * fVar243;
    auVar234._8_4_ = fVar221 * fVar220;
    auVar234._12_4_ = fVar206 * fVar167;
    auVar234._16_4_ = fVar183 * 0.0;
    auVar234._20_4_ = fVar15 * 0.0;
    auVar234._28_36_ = auVar245._28_36_;
    auVar234._24_4_ = fVar16 * 0.0;
    fVar207 = auVar255._28_4_;
    auVar102 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar205,CONCAT48(fVar204,CONCAT44(fVar203,fVar182)
                                                                  ))),auVar98);
    fVar249 = auVar102._28_4_ + auVar147._0_4_;
    fVar232 = fVar249 + auVar252._28_4_ + auVar231._28_4_;
    auVar40._4_4_ = fVar162 * 0.16666667;
    auVar40._0_4_ = fVar145 * 0.16666667;
    auVar40._8_4_ = fVar163 * 0.16666667;
    auVar40._12_4_ = fVar164 * 0.16666667;
    auVar40._16_4_ = fVar165 * 0.16666667;
    auVar40._20_4_ = fVar166 * 0.16666667;
    auVar40._24_4_ = fVar168 * 0.16666667;
    auVar40._28_4_ = fVar249;
    auVar41._4_4_ =
         (auVar234._4_4_ * fVar243 * 12.0 + auVar234._4_4_ * fVar244 * 6.0 +
         fVar203 + auVar101._4_4_) * 0.16666667;
    auVar41._0_4_ =
         (auVar234._0_4_ * fVar144 * 12.0 + auVar234._0_4_ * fVar242 * 6.0 +
         fVar182 + auVar101._0_4_) * 0.16666667;
    auVar41._8_4_ =
         (auVar234._8_4_ * fVar220 * 12.0 + auVar234._8_4_ * fVar221 * 6.0 +
         fVar204 + auVar101._8_4_) * 0.16666667;
    auVar41._12_4_ =
         (auVar234._12_4_ * fVar167 * 12.0 + auVar234._12_4_ * fVar206 * 6.0 +
         fVar205 + auVar101._12_4_) * 0.16666667;
    auVar41._16_4_ =
         (auVar234._16_4_ * fVar183 * 12.0 + auVar234._16_4_ * 0.0 * 6.0 + auVar101._16_4_ + 0.0) *
         0.16666667;
    auVar41._20_4_ =
         (auVar234._20_4_ * fVar15 * 12.0 + auVar234._20_4_ * 0.0 * 6.0 + auVar101._20_4_ + 0.0) *
         0.16666667;
    auVar41._24_4_ =
         (auVar234._24_4_ * fVar16 * 12.0 + auVar234._24_4_ * 0.0 * 6.0 + auVar101._24_4_ + 0.0) *
         0.16666667;
    auVar41._28_4_ = auVar252._28_4_;
    auVar42._4_4_ =
         (auVar102._4_4_ + fVar162 +
         auVar234._4_4_ * fVar244 * 12.0 + auVar234._4_4_ * fVar243 * 6.0) * 0.16666667;
    auVar42._0_4_ =
         (auVar102._0_4_ + fVar145 +
         auVar234._0_4_ * fVar242 * 12.0 + auVar234._0_4_ * fVar144 * 6.0) * 0.16666667;
    auVar42._8_4_ =
         (auVar102._8_4_ + fVar163 +
         auVar234._8_4_ * fVar221 * 12.0 + auVar234._8_4_ * fVar220 * 6.0) * 0.16666667;
    auVar42._12_4_ =
         (auVar102._12_4_ + fVar164 +
         auVar234._12_4_ * fVar206 * 12.0 + auVar234._12_4_ * fVar167 * 6.0) * 0.16666667;
    auVar42._16_4_ =
         (auVar102._16_4_ + fVar165 + auVar234._16_4_ * 0.0 * 12.0 + auVar234._16_4_ * fVar183 * 6.0
         ) * 0.16666667;
    auVar42._20_4_ =
         (auVar102._20_4_ + fVar166 + auVar234._20_4_ * 0.0 * 12.0 + auVar234._20_4_ * fVar15 * 6.0)
         * 0.16666667;
    auVar42._24_4_ =
         (auVar102._24_4_ + fVar168 + auVar234._24_4_ * 0.0 * 12.0 + auVar234._24_4_ * fVar16 * 6.0)
         * 0.16666667;
    auVar42._28_4_ = fVar207;
    fVar182 = fVar182 * 0.16666667;
    fVar203 = fVar203 * 0.16666667;
    fVar204 = fVar204 * 0.16666667;
    fVar205 = fVar205 * 0.16666667;
    auVar43._28_4_ = fVar232;
    auVar43._0_28_ = ZEXT1628(CONCAT412(fVar205,CONCAT48(fVar204,CONCAT44(fVar203,fVar182))));
    auVar102 = vmulps_avx512vl(auVar270._0_32_,auVar43);
    auVar44._4_4_ = (float)local_1e0._4_4_ * fVar203;
    auVar44._0_4_ = (float)local_1e0._0_4_ * fVar182;
    auVar44._8_4_ = fStack_1d8 * fVar204;
    auVar44._12_4_ = fStack_1d4 * fVar205;
    auVar44._16_4_ = fStack_1d0 * 0.0;
    auVar44._20_4_ = fStack_1cc * 0.0;
    auVar44._24_4_ = fStack_1c8 * 0.0;
    auVar44._28_4_ = auVar248._28_4_ + fVar207 + auVar101._28_4_ + 0.0;
    auVar101 = vmulps_avx512vl(local_240,auVar43);
    auVar45._4_4_ = local_260._4_4_ * fVar203;
    auVar45._0_4_ = local_260._0_4_ * fVar182;
    auVar45._8_4_ = local_260._8_4_ * fVar204;
    auVar45._12_4_ = local_260._12_4_ * fVar205;
    auVar45._16_4_ = local_260._16_4_ * 0.0;
    auVar45._20_4_ = local_260._20_4_ * 0.0;
    auVar45._24_4_ = local_260._24_4_ * 0.0;
    auVar45._28_4_ = fVar232;
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar42,auVar266._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar44,auVar42,auVar267._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar42,auVar268._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar45,auVar269._0_32_,auVar42);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar41,auVar260._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar41,auVar261._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar41,auVar262._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar264._0_32_,auVar41);
    auVar104 = vfmadd231ps_avx512vl(auVar102,auVar40,auVar263._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar103,auVar40,auVar257._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar101,auVar40,auVar258._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar99,auVar259._0_32_,auVar40);
    auVar107 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar102 = vxorps_avx512vl(auVar100,auVar107);
    auVar103 = vxorps_avx512vl(ZEXT1632(auVar89),auVar107);
    auVar224._0_4_ = auVar103._0_4_ * fVar242;
    auVar224._4_4_ = auVar103._4_4_ * fVar244;
    auVar224._8_4_ = auVar103._8_4_ * fVar221;
    auVar224._12_4_ = auVar103._12_4_ * fVar206;
    auVar224._16_4_ = auVar103._16_4_ * 0.0;
    auVar224._20_4_ = auVar103._20_4_ * 0.0;
    auVar224._24_4_ = auVar103._24_4_ * 0.0;
    auVar224._28_4_ = 0;
    auVar99 = vmulps_avx512vl(auVar234._0_32_,auVar98);
    auVar98 = vsubps_avx(auVar224,auVar99);
    auVar46._4_4_ = auVar102._4_4_ * fVar243 * 0.5;
    auVar46._0_4_ = auVar102._0_4_ * fVar144 * 0.5;
    auVar46._8_4_ = auVar102._8_4_ * fVar220 * 0.5;
    auVar46._12_4_ = auVar102._12_4_ * fVar167 * 0.5;
    auVar46._16_4_ = auVar102._16_4_ * fVar183 * 0.5;
    auVar46._20_4_ = auVar102._20_4_ * fVar15 * 0.5;
    auVar46._24_4_ = auVar102._24_4_ * fVar16 * 0.5;
    auVar46._28_4_ = auVar100._28_4_;
    auVar47._4_4_ = auVar98._4_4_ * 0.5;
    auVar47._0_4_ = auVar98._0_4_ * 0.5;
    auVar47._8_4_ = auVar98._8_4_ * 0.5;
    auVar47._12_4_ = auVar98._12_4_ * 0.5;
    auVar47._16_4_ = auVar98._16_4_ * 0.5;
    auVar47._20_4_ = auVar98._20_4_ * 0.5;
    auVar47._24_4_ = auVar98._24_4_ * 0.5;
    auVar47._28_4_ = auVar98._28_4_;
    auVar48._4_4_ = (auVar99._4_4_ + fVar243 * fVar243) * 0.5;
    auVar48._0_4_ = (auVar99._0_4_ + fVar144 * fVar144) * 0.5;
    auVar48._8_4_ = (auVar99._8_4_ + fVar220 * fVar220) * 0.5;
    auVar48._12_4_ = (auVar99._12_4_ + fVar167 * fVar167) * 0.5;
    auVar48._16_4_ = (auVar99._16_4_ + fVar183 * fVar183) * 0.5;
    auVar48._20_4_ = (auVar99._20_4_ + fVar15 * fVar15) * 0.5;
    auVar48._24_4_ = (auVar99._24_4_ + fVar16 * fVar16) * 0.5;
    auVar48._28_4_ = auVar99._28_4_ + auVar239._28_4_;
    fVar144 = fVar242 * fVar242 * 0.5;
    fVar242 = fVar244 * fVar244 * 0.5;
    fVar243 = fVar221 * fVar221 * 0.5;
    fVar244 = fVar206 * fVar206 * 0.5;
    auVar49._28_4_ = auVar241._28_4_;
    auVar49._0_28_ = ZEXT1628(CONCAT412(fVar244,CONCAT48(fVar243,CONCAT44(fVar242,fVar144))));
    auVar50._4_4_ = auVar270._4_4_ * fVar242;
    auVar50._0_4_ = auVar270._0_4_ * fVar144;
    auVar50._8_4_ = auVar270._8_4_ * fVar243;
    auVar50._12_4_ = auVar270._12_4_ * fVar244;
    auVar50._16_4_ = auVar270._16_4_ * 0.0;
    auVar50._20_4_ = auVar270._20_4_ * 0.0;
    auVar50._24_4_ = auVar270._24_4_ * 0.0;
    auVar50._28_4_ = 0x3f000000;
    auVar51._4_4_ = (float)local_1e0._4_4_ * fVar242;
    auVar51._0_4_ = (float)local_1e0._0_4_ * fVar144;
    auVar51._8_4_ = fStack_1d8 * fVar243;
    auVar51._12_4_ = fStack_1d4 * fVar244;
    auVar51._16_4_ = fStack_1d0 * 0.0;
    auVar51._20_4_ = fStack_1cc * 0.0;
    auVar51._24_4_ = fStack_1c8 * 0.0;
    auVar51._28_4_ = auVar103._28_4_;
    auVar100 = vmulps_avx512vl(local_240,auVar49);
    auVar52._4_4_ = fVar242 * local_260._4_4_;
    auVar52._0_4_ = fVar144 * local_260._0_4_;
    auVar52._8_4_ = fVar243 * local_260._8_4_;
    auVar52._12_4_ = fVar244 * local_260._12_4_;
    auVar52._16_4_ = local_260._16_4_ * 0.0;
    auVar52._20_4_ = local_260._20_4_ * 0.0;
    auVar52._24_4_ = local_260._24_4_ * 0.0;
    auVar52._28_4_ = auVar241._28_4_;
    auVar98 = vfmadd231ps_avx512vl(auVar50,auVar48,auVar266._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar51,auVar48,auVar267._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar48,auVar268._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar52,auVar269._0_32_,auVar48);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar47,auVar260._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar47,auVar261._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar47,auVar262._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar264._0_32_,auVar47);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar46,auVar263._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar46,auVar257._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar46,auVar258._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar259._0_32_,auVar46);
    auVar53._4_4_ = auVar98._4_4_ * fVar17;
    auVar53._0_4_ = auVar98._0_4_ * fVar17;
    auVar53._8_4_ = auVar98._8_4_ * fVar17;
    auVar53._12_4_ = auVar98._12_4_ * fVar17;
    auVar53._16_4_ = auVar98._16_4_ * fVar17;
    auVar53._20_4_ = auVar98._20_4_ * fVar17;
    auVar53._24_4_ = auVar98._24_4_ * fVar17;
    auVar53._28_4_ = auVar270._28_4_;
    auVar252 = ZEXT3264(auVar53);
    auVar54._4_4_ = auVar102._4_4_ * fVar17;
    auVar54._0_4_ = auVar102._0_4_ * fVar17;
    auVar54._8_4_ = auVar102._8_4_ * fVar17;
    auVar54._12_4_ = auVar102._12_4_ * fVar17;
    auVar54._16_4_ = auVar102._16_4_ * fVar17;
    auVar54._20_4_ = auVar102._20_4_ * fVar17;
    auVar54._24_4_ = auVar102._24_4_ * fVar17;
    auVar54._28_4_ = fVar207;
    auVar255 = ZEXT3264(auVar54);
    auVar55._4_4_ = auVar100._4_4_ * fVar17;
    auVar55._0_4_ = auVar100._0_4_ * fVar17;
    auVar55._8_4_ = auVar100._8_4_ * fVar17;
    auVar55._12_4_ = auVar100._12_4_ * fVar17;
    auVar55._16_4_ = auVar100._16_4_ * fVar17;
    auVar55._20_4_ = auVar100._20_4_ * fVar17;
    auVar55._24_4_ = auVar100._24_4_ * fVar17;
    auVar55._28_4_ = auVar100._28_4_;
    fVar207 = auVar103._0_4_ * fVar17;
    fVar144 = auVar103._4_4_ * fVar17;
    auVar56._4_4_ = fVar144;
    auVar56._0_4_ = fVar207;
    fVar242 = auVar103._8_4_ * fVar17;
    auVar56._8_4_ = fVar242;
    fVar243 = auVar103._12_4_ * fVar17;
    auVar56._12_4_ = fVar243;
    fVar244 = auVar103._16_4_ * fVar17;
    auVar56._16_4_ = fVar244;
    fVar220 = auVar103._20_4_ * fVar17;
    auVar56._20_4_ = fVar220;
    fVar221 = auVar103._24_4_ * fVar17;
    auVar56._24_4_ = fVar221;
    auVar56._28_4_ = fVar17;
    auVar89 = vxorps_avx512vl(auVar269._0_16_,auVar269._0_16_);
    auVar97 = vpermt2ps_avx512vl(auVar104,_DAT_01feed00,ZEXT1632(auVar89));
    auVar241 = ZEXT3264(auVar97);
    auVar108 = vpermt2ps_avx512vl(auVar105,_DAT_01feed00,ZEXT1632(auVar89));
    auVar245 = ZEXT3264(auVar108);
    auVar102 = ZEXT1632(auVar89);
    auVar109 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,auVar102);
    auVar248 = ZEXT3264(auVar109);
    auVar225._0_4_ = fVar207 + auVar101._0_4_;
    auVar225._4_4_ = fVar144 + auVar101._4_4_;
    auVar225._8_4_ = fVar242 + auVar101._8_4_;
    auVar225._12_4_ = fVar243 + auVar101._12_4_;
    auVar225._16_4_ = fVar244 + auVar101._16_4_;
    auVar225._20_4_ = fVar220 + auVar101._20_4_;
    auVar225._24_4_ = fVar221 + auVar101._24_4_;
    auVar225._28_4_ = fVar17 + auVar101._28_4_;
    auVar100 = vmaxps_avx(auVar101,auVar225);
    auVar98 = vminps_avx(auVar101,auVar225);
    auVar95 = vpermt2ps_avx512vl(auVar101,_DAT_01feed00,auVar102);
    auVar96 = vpermt2ps_avx512vl(auVar53,_DAT_01feed00,auVar102);
    auVar110 = vpermt2ps_avx512vl(auVar54,_DAT_01feed00,auVar102);
    auVar121 = ZEXT1632(auVar89);
    auVar111 = vpermt2ps_avx512vl(auVar55,_DAT_01feed00,auVar121);
    auVar101 = vpermt2ps_avx512vl(auVar56,_DAT_01feed00,auVar121);
    auVar101 = vsubps_avx(auVar95,auVar101);
    auVar102 = vsubps_avx(auVar97,auVar104);
    auVar103 = vsubps_avx(auVar108,auVar105);
    auVar99 = vsubps_avx(auVar109,auVar106);
    auVar231 = ZEXT3264(auVar99);
    auVar112 = vmulps_avx512vl(auVar103,auVar55);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar54,auVar99);
    auVar113 = vmulps_avx512vl(auVar99,auVar53);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar55,auVar102);
    auVar114 = vmulps_avx512vl(auVar102,auVar54);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar53,auVar103);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar113 = vmulps_avx512vl(auVar99,auVar99);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar103,auVar103);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar102,auVar102);
    auVar114 = vrcp14ps_avx512vl(auVar113);
    auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar116 = vfnmadd213ps_avx512vl(auVar114,auVar113,auVar115);
    auVar114 = vfmadd132ps_avx512vl(auVar116,auVar114,auVar114);
    auVar112 = vmulps_avx512vl(auVar112,auVar114);
    auVar116 = vmulps_avx512vl(auVar103,auVar111);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar110,auVar99);
    auVar117 = vmulps_avx512vl(auVar99,auVar96);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar111,auVar102);
    auVar118 = vmulps_avx512vl(auVar102,auVar110);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar96,auVar103);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar116,auVar114);
    auVar112 = vmaxps_avx512vl(auVar112,auVar114);
    auVar112 = vsqrtps_avx512vl(auVar112);
    auVar114 = vmaxps_avx512vl(auVar101,auVar95);
    auVar100 = vmaxps_avx512vl(auVar100,auVar114);
    auVar114 = vaddps_avx512vl(auVar112,auVar100);
    auVar100 = vminps_avx(auVar101,auVar95);
    auVar100 = vminps_avx(auVar98,auVar100);
    auVar100 = vsubps_avx512vl(auVar100,auVar112);
    auVar29._8_4_ = 0x3f800002;
    auVar29._0_8_ = 0x3f8000023f800002;
    auVar29._12_4_ = 0x3f800002;
    auVar29._16_4_ = 0x3f800002;
    auVar29._20_4_ = 0x3f800002;
    auVar29._24_4_ = 0x3f800002;
    auVar29._28_4_ = 0x3f800002;
    auVar98 = vmulps_avx512vl(auVar114,auVar29);
    auVar30._8_4_ = 0x3f7ffffc;
    auVar30._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar30._12_4_ = 0x3f7ffffc;
    auVar30._16_4_ = 0x3f7ffffc;
    auVar30._20_4_ = 0x3f7ffffc;
    auVar30._24_4_ = 0x3f7ffffc;
    auVar30._28_4_ = 0x3f7ffffc;
    local_900 = vmulps_avx512vl(auVar100,auVar30);
    auVar100 = vmulps_avx512vl(auVar98,auVar98);
    auVar98 = vrsqrt14ps_avx512vl(auVar113);
    auVar31._8_4_ = 0xbf000000;
    auVar31._0_8_ = 0xbf000000bf000000;
    auVar31._12_4_ = 0xbf000000;
    auVar31._16_4_ = 0xbf000000;
    auVar31._20_4_ = 0xbf000000;
    auVar31._24_4_ = 0xbf000000;
    auVar31._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar113,auVar31);
    fVar207 = auVar98._0_4_;
    fVar144 = auVar98._4_4_;
    fVar242 = auVar98._8_4_;
    fVar243 = auVar98._12_4_;
    fVar244 = auVar98._16_4_;
    fVar220 = auVar98._20_4_;
    fVar221 = auVar98._24_4_;
    auVar57._4_4_ = fVar144 * fVar144 * fVar144 * auVar101._4_4_;
    auVar57._0_4_ = fVar207 * fVar207 * fVar207 * auVar101._0_4_;
    auVar57._8_4_ = fVar242 * fVar242 * fVar242 * auVar101._8_4_;
    auVar57._12_4_ = fVar243 * fVar243 * fVar243 * auVar101._12_4_;
    auVar57._16_4_ = fVar244 * fVar244 * fVar244 * auVar101._16_4_;
    auVar57._20_4_ = fVar220 * fVar220 * fVar220 * auVar101._20_4_;
    auVar57._24_4_ = fVar221 * fVar221 * fVar221 * auVar101._24_4_;
    auVar57._28_4_ = auVar114._28_4_;
    auVar32._8_4_ = 0x3fc00000;
    auVar32._0_8_ = 0x3fc000003fc00000;
    auVar32._12_4_ = 0x3fc00000;
    auVar32._16_4_ = 0x3fc00000;
    auVar32._20_4_ = 0x3fc00000;
    auVar32._24_4_ = 0x3fc00000;
    auVar32._28_4_ = 0x3fc00000;
    auVar98 = vfmadd231ps_avx512vl(auVar57,auVar98,auVar32);
    auVar101 = vmulps_avx512vl(auVar102,auVar98);
    auVar95 = vmulps_avx512vl(auVar103,auVar98);
    auVar112 = vmulps_avx512vl(auVar99,auVar98);
    auVar113 = vsubps_avx512vl(auVar121,auVar104);
    auVar114 = vsubps_avx512vl(auVar121,auVar105);
    auVar116 = vsubps_avx512vl(auVar121,auVar106);
    auVar70._4_4_ = uStack_3bc;
    auVar70._0_4_ = local_3c0;
    auVar70._8_4_ = uStack_3b8;
    auVar70._12_4_ = uStack_3b4;
    auVar70._16_4_ = uStack_3b0;
    auVar70._20_4_ = uStack_3ac;
    auVar70._24_4_ = uStack_3a8;
    auVar70._28_4_ = uStack_3a4;
    auVar117 = vmulps_avx512vl(auVar70,auVar116);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar265._0_32_,auVar114);
    auVar117 = vfmadd231ps_avx512vl(auVar117,local_340,auVar113);
    auVar118 = vmulps_avx512vl(auVar116,auVar116);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar114,auVar114);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar113,auVar113);
    auVar119 = vmulps_avx512vl(auVar70,auVar112);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar95,auVar265._0_32_);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar101,local_340);
    auVar112 = vmulps_avx512vl(auVar116,auVar112);
    auVar95 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar95);
    auVar101 = vfmadd231ps_avx512vl(auVar95,auVar113,auVar101);
    auVar95 = vmulps_avx512vl(auVar119,auVar119);
    auVar112 = vsubps_avx512vl(local_200,auVar95);
    auVar120 = vmulps_avx512vl(auVar119,auVar101);
    auVar117 = vsubps_avx512vl(auVar117,auVar120);
    auVar117 = vaddps_avx512vl(auVar117,auVar117);
    auVar120 = vmulps_avx512vl(auVar101,auVar101);
    local_5a0 = vsubps_avx512vl(auVar118,auVar120);
    auVar100 = vsubps_avx512vl(local_5a0,auVar100);
    local_4e0 = vmulps_avx512vl(auVar117,auVar117);
    auVar33._8_4_ = 0x40800000;
    auVar33._0_8_ = 0x4080000040800000;
    auVar33._12_4_ = 0x40800000;
    auVar33._16_4_ = 0x40800000;
    auVar33._20_4_ = 0x40800000;
    auVar33._24_4_ = 0x40800000;
    auVar33._28_4_ = 0x40800000;
    _local_500 = vmulps_avx512vl(auVar112,auVar33);
    auVar118 = vmulps_avx512vl(_local_500,auVar100);
    auVar118 = vsubps_avx512vl(local_4e0,auVar118);
    uVar85 = vcmpps_avx512vl(auVar118,auVar121,5);
    bVar75 = (byte)uVar85;
    if (bVar75 == 0) {
LAB_01ca2099:
      auVar265 = ZEXT3264(local_640);
      auVar269 = ZEXT3264(local_7c0);
      auVar268 = ZEXT3264(local_740);
      auVar267 = ZEXT3264(local_720);
      auVar266 = ZEXT3264(local_860);
      auVar264 = ZEXT3264(local_700);
      auVar263 = ZEXT3264(local_7e0);
      auVar262 = ZEXT3264(local_840);
      auVar261 = ZEXT3264(local_6e0);
      auVar260 = ZEXT3264(local_820);
      auVar259 = ZEXT3264(local_6c0);
      auVar258 = ZEXT3264(local_6a0);
      auVar257 = ZEXT3264(local_800);
      auVar239 = ZEXT3264(_local_8e0);
      auVar234 = ZEXT3264(auVar115);
      auVar270 = ZEXT3264(local_880);
    }
    else {
      auVar120 = _local_500;
      auVar118 = vsqrtps_avx512vl(auVar118);
      auVar121 = vaddps_avx512vl(auVar112,auVar112);
      local_400 = vrcp14ps_avx512vl(auVar121);
      auVar122 = vfnmadd213ps_avx512vl(local_400,auVar121,auVar115);
      auVar122 = vfmadd132ps_avx512vl(auVar122,local_400,local_400);
      local_680 = vxorps_avx512vl(auVar117,auVar107);
      auVar107 = vsubps_avx512vl(local_680,auVar118);
      auVar107 = vmulps_avx512vl(auVar107,auVar122);
      auVar118 = vsubps_avx512vl(auVar118,auVar117);
      local_660 = vmulps_avx512vl(auVar118,auVar122);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar118 = vblendmps_avx512vl(auVar118,auVar107);
      auVar123._0_4_ =
           (uint)(bVar75 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar122._0_4_;
      bVar84 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar84 * auVar118._4_4_ | (uint)!bVar84 * auVar122._4_4_;
      bVar84 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar84 * auVar118._8_4_ | (uint)!bVar84 * auVar122._8_4_;
      bVar84 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar84 * auVar118._12_4_ | (uint)!bVar84 * auVar122._12_4_;
      bVar84 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar84 * auVar118._16_4_ | (uint)!bVar84 * auVar122._16_4_;
      bVar84 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar84 * auVar118._20_4_ | (uint)!bVar84 * auVar122._20_4_;
      bVar84 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar84 * auVar118._24_4_ | (uint)!bVar84 * auVar122._24_4_;
      bVar84 = SUB81(uVar85 >> 7,0);
      auVar123._28_4_ = (uint)bVar84 * auVar118._28_4_ | (uint)!bVar84 * auVar122._28_4_;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar122 = vblendmps_avx512vl(auVar118,local_660);
      auVar124._0_4_ =
           (uint)(bVar75 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar118._0_4_;
      bVar84 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar84 * auVar122._4_4_ | (uint)!bVar84 * auVar118._4_4_;
      bVar84 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar84 * auVar122._8_4_ | (uint)!bVar84 * auVar118._8_4_;
      bVar84 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar84 * auVar122._12_4_ | (uint)!bVar84 * auVar118._12_4_;
      bVar84 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar84 * auVar122._16_4_ | (uint)!bVar84 * auVar118._16_4_;
      bVar84 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar84 * auVar122._20_4_ | (uint)!bVar84 * auVar118._20_4_;
      bVar84 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar84 * auVar122._24_4_ | (uint)!bVar84 * auVar118._24_4_;
      bVar84 = SUB81(uVar85 >> 7,0);
      auVar124._28_4_ = (uint)bVar84 * auVar122._28_4_ | (uint)!bVar84 * auVar118._28_4_;
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar95,auVar118);
      _local_420 = vmaxps_avx512vl(local_220,auVar118);
      auVar34._8_4_ = 0x36000000;
      auVar34._0_8_ = 0x3600000036000000;
      auVar34._12_4_ = 0x36000000;
      auVar34._16_4_ = 0x36000000;
      auVar34._20_4_ = 0x36000000;
      auVar34._24_4_ = 0x36000000;
      auVar34._28_4_ = 0x36000000;
      local_440 = vmulps_avx512vl(_local_420,auVar34);
      vandps_avx512vl(auVar112,auVar118);
      uVar80 = vcmpps_avx512vl(local_440,local_440,1);
      uVar85 = uVar85 & uVar80;
      bVar79 = (byte)uVar85;
      if (bVar79 != 0) {
        uVar80 = vcmpps_avx512vl(auVar100,_DAT_01faff00,2);
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar112 = vblendmps_avx512vl(auVar100,auVar95);
        bVar77 = (byte)uVar80;
        uVar86 = (uint)(bVar77 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar100._0_4_;
        bVar84 = (bool)((byte)(uVar80 >> 1) & 1);
        uVar137 = (uint)bVar84 * auVar112._4_4_ | (uint)!bVar84 * auVar100._4_4_;
        bVar84 = (bool)((byte)(uVar80 >> 2) & 1);
        uVar138 = (uint)bVar84 * auVar112._8_4_ | (uint)!bVar84 * auVar100._8_4_;
        bVar84 = (bool)((byte)(uVar80 >> 3) & 1);
        uVar139 = (uint)bVar84 * auVar112._12_4_ | (uint)!bVar84 * auVar100._12_4_;
        bVar84 = (bool)((byte)(uVar80 >> 4) & 1);
        uVar140 = (uint)bVar84 * auVar112._16_4_ | (uint)!bVar84 * auVar100._16_4_;
        bVar84 = (bool)((byte)(uVar80 >> 5) & 1);
        uVar141 = (uint)bVar84 * auVar112._20_4_ | (uint)!bVar84 * auVar100._20_4_;
        bVar84 = (bool)((byte)(uVar80 >> 6) & 1);
        uVar142 = (uint)bVar84 * auVar112._24_4_ | (uint)!bVar84 * auVar100._24_4_;
        bVar84 = SUB81(uVar80 >> 7,0);
        uVar143 = (uint)bVar84 * auVar112._28_4_ | (uint)!bVar84 * auVar100._28_4_;
        auVar123._0_4_ = (bVar79 & 1) * uVar86 | !(bool)(bVar79 & 1) * auVar123._0_4_;
        bVar84 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar123._4_4_ = bVar84 * uVar137 | !bVar84 * auVar123._4_4_;
        bVar84 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar123._8_4_ = bVar84 * uVar138 | !bVar84 * auVar123._8_4_;
        bVar84 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar123._12_4_ = bVar84 * uVar139 | !bVar84 * auVar123._12_4_;
        bVar84 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar123._16_4_ = bVar84 * uVar140 | !bVar84 * auVar123._16_4_;
        bVar84 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar123._20_4_ = bVar84 * uVar141 | !bVar84 * auVar123._20_4_;
        bVar84 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar123._24_4_ = bVar84 * uVar142 | !bVar84 * auVar123._24_4_;
        bVar84 = SUB81(uVar85 >> 7,0);
        auVar123._28_4_ = bVar84 * uVar143 | !bVar84 * auVar123._28_4_;
        auVar100 = vblendmps_avx512vl(auVar95,auVar100);
        bVar84 = (bool)((byte)(uVar80 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar80 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar80 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar80 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar80 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar80 >> 6) & 1);
        bVar14 = SUB81(uVar80 >> 7,0);
        auVar124._0_4_ =
             (uint)(bVar79 & 1) *
             ((uint)(bVar77 & 1) * auVar100._0_4_ | !(bool)(bVar77 & 1) * uVar86) |
             !(bool)(bVar79 & 1) * auVar124._0_4_;
        bVar8 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar124._4_4_ =
             (uint)bVar8 * ((uint)bVar84 * auVar100._4_4_ | !bVar84 * uVar137) |
             !bVar8 * auVar124._4_4_;
        bVar84 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar124._8_4_ =
             (uint)bVar84 * ((uint)bVar9 * auVar100._8_4_ | !bVar9 * uVar138) |
             !bVar84 * auVar124._8_4_;
        bVar84 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar124._12_4_ =
             (uint)bVar84 * ((uint)bVar10 * auVar100._12_4_ | !bVar10 * uVar139) |
             !bVar84 * auVar124._12_4_;
        bVar84 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar124._16_4_ =
             (uint)bVar84 * ((uint)bVar11 * auVar100._16_4_ | !bVar11 * uVar140) |
             !bVar84 * auVar124._16_4_;
        bVar84 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar124._20_4_ =
             (uint)bVar84 * ((uint)bVar12 * auVar100._20_4_ | !bVar12 * uVar141) |
             !bVar84 * auVar124._20_4_;
        bVar84 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar124._24_4_ =
             (uint)bVar84 * ((uint)bVar13 * auVar100._24_4_ | !bVar13 * uVar142) |
             !bVar84 * auVar124._24_4_;
        bVar84 = SUB81(uVar85 >> 7,0);
        auVar124._28_4_ =
             (uint)bVar84 * ((uint)bVar14 * auVar100._28_4_ | !bVar14 * uVar143) |
             !bVar84 * auVar124._28_4_;
        bVar75 = (~bVar79 | bVar77) & bVar75;
      }
      auVar71._4_4_ = uStack_3bc;
      auVar71._0_4_ = local_3c0;
      auVar71._8_4_ = uStack_3b8;
      auVar71._12_4_ = uStack_3b4;
      auVar71._16_4_ = uStack_3b0;
      auVar71._20_4_ = uStack_3ac;
      auVar71._24_4_ = uStack_3a8;
      auVar71._28_4_ = uStack_3a4;
      if ((bVar75 & 0x7f) == 0) {
        auVar115._8_4_ = 0x3f800000;
        auVar115._0_8_ = 0x3f8000003f800000;
        auVar115._12_4_ = 0x3f800000;
        auVar115._16_4_ = 0x3f800000;
        auVar115._20_4_ = 0x3f800000;
        auVar115._24_4_ = 0x3f800000;
        auVar115._28_4_ = 0x3f800000;
        goto LAB_01ca2099;
      }
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar111 = vxorps_avx512vl(auVar111,auVar95);
      auVar96 = vxorps_avx512vl(auVar96,auVar95);
      auVar110 = vxorps_avx512vl(auVar110,auVar95);
      auVar89 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_4c0);
      auVar100 = vbroadcastss_avx512vl(auVar89);
      auVar112 = vmaxps_avx512vl(auVar100,auVar123);
      auVar89 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_4c0);
      auVar100 = vbroadcastss_avx512vl(auVar89);
      auVar118 = vminps_avx512vl(auVar100,auVar124);
      auVar100 = vmulps_avx512vl(auVar55,auVar116);
      auVar100 = vfmadd213ps_avx512vl(auVar114,auVar54,auVar100);
      auVar89 = vfmadd213ps_fma(auVar113,auVar53,auVar100);
      auVar100 = vmulps_avx512vl(auVar71,auVar55);
      auVar265 = ZEXT3264(local_640);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_640,auVar54);
      auVar113 = vfmadd231ps_avx512vl(auVar100,local_340,auVar53);
      auVar250._8_4_ = 0x7fffffff;
      auVar250._0_8_ = 0x7fffffff7fffffff;
      auVar250._12_4_ = 0x7fffffff;
      auVar250._16_4_ = 0x7fffffff;
      auVar250._20_4_ = 0x7fffffff;
      auVar250._24_4_ = 0x7fffffff;
      auVar250._28_4_ = 0x7fffffff;
      auVar100 = vandps_avx(auVar250,auVar113);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar18 = vcmpps_avx512vl(auVar100,auVar114,1);
      auVar100 = vxorps_avx512vl(ZEXT1632(auVar89),auVar95);
      auVar116 = vrcp14ps_avx512vl(auVar113);
      auVar122 = vxorps_avx512vl(auVar113,auVar95);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar125 = vfnmadd213ps_avx512vl(auVar116,auVar113,auVar115);
      auVar89 = vfmadd132ps_fma(auVar125,auVar116,auVar116);
      fVar207 = auVar89._0_4_ * auVar100._0_4_;
      fVar144 = auVar89._4_4_ * auVar100._4_4_;
      auVar58._4_4_ = fVar144;
      auVar58._0_4_ = fVar207;
      fVar242 = auVar89._8_4_ * auVar100._8_4_;
      auVar58._8_4_ = fVar242;
      fVar243 = auVar89._12_4_ * auVar100._12_4_;
      auVar58._12_4_ = fVar243;
      fVar244 = auVar100._16_4_ * 0.0;
      auVar58._16_4_ = fVar244;
      fVar220 = auVar100._20_4_ * 0.0;
      auVar58._20_4_ = fVar220;
      fVar221 = auVar100._24_4_ * 0.0;
      auVar58._24_4_ = fVar221;
      auVar58._28_4_ = auVar100._28_4_;
      uVar20 = vcmpps_avx512vl(auVar113,auVar122,1);
      bVar79 = (byte)uVar18 | (byte)uVar20;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar126 = vblendmps_avx512vl(auVar58,auVar125);
      auVar127._0_4_ =
           (uint)(bVar79 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar116._0_4_;
      bVar84 = (bool)(bVar79 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar84 * auVar126._4_4_ | (uint)!bVar84 * auVar116._4_4_;
      bVar84 = (bool)(bVar79 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar84 * auVar126._8_4_ | (uint)!bVar84 * auVar116._8_4_;
      bVar84 = (bool)(bVar79 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar84 * auVar126._12_4_ | (uint)!bVar84 * auVar116._12_4_;
      bVar84 = (bool)(bVar79 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar84 * auVar126._16_4_ | (uint)!bVar84 * auVar116._16_4_;
      bVar84 = (bool)(bVar79 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar84 * auVar126._20_4_ | (uint)!bVar84 * auVar116._20_4_;
      bVar84 = (bool)(bVar79 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar84 * auVar126._24_4_ | (uint)!bVar84 * auVar116._24_4_;
      auVar127._28_4_ =
           (uint)(bVar79 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar116._28_4_;
      auVar112 = vmaxps_avx512vl(auVar112,auVar127);
      auVar252 = ZEXT3264(auVar112);
      uVar20 = vcmpps_avx512vl(auVar113,auVar122,6);
      bVar79 = (byte)uVar18 | (byte)uVar20;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar128._0_4_ =
           (uint)(bVar79 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar79 & 1) * (int)fVar207;
      bVar84 = (bool)(bVar79 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar84 * auVar113._4_4_ | (uint)!bVar84 * (int)fVar144;
      bVar84 = (bool)(bVar79 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar84 * auVar113._8_4_ | (uint)!bVar84 * (int)fVar242;
      bVar84 = (bool)(bVar79 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar84 * auVar113._12_4_ | (uint)!bVar84 * (int)fVar243;
      bVar84 = (bool)(bVar79 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar84 * auVar113._16_4_ | (uint)!bVar84 * (int)fVar244;
      bVar84 = (bool)(bVar79 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar84 * auVar113._20_4_ | (uint)!bVar84 * (int)fVar220;
      bVar84 = (bool)(bVar79 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar84 * auVar113._24_4_ | (uint)!bVar84 * (int)fVar221;
      auVar128._28_4_ =
           (uint)(bVar79 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar100._28_4_;
      auVar116 = vminps_avx512vl(auVar118,auVar128);
      auVar100 = vsubps_avx(ZEXT832(0) << 0x20,auVar97);
      auVar97 = vsubps_avx(ZEXT832(0) << 0x20,auVar108);
      auVar118 = ZEXT832(0) << 0x20;
      auVar108 = vsubps_avx(auVar118,auVar109);
      auVar108 = vmulps_avx512vl(auVar108,auVar111);
      auVar97 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar97);
      auVar100 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar100);
      auVar97 = vmulps_avx512vl(auVar71,auVar111);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_640,auVar110);
      auVar97 = vfmadd231ps_avx512vl(auVar97,local_340,auVar96);
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar35._16_4_ = 0x7fffffff;
      auVar35._20_4_ = 0x7fffffff;
      auVar35._24_4_ = 0x7fffffff;
      auVar35._28_4_ = 0x7fffffff;
      vandps_avx512vl(auVar97,auVar35);
      uVar18 = vcmpps_avx512vl(auVar97,auVar114,1);
      auVar100 = vxorps_avx512vl(auVar100,auVar95);
      auVar108 = vrcp14ps_avx512vl(auVar97);
      auVar109 = vxorps_avx512vl(auVar97,auVar95);
      auVar248 = ZEXT3264(auVar109);
      auVar95 = vfnmadd213ps_avx512vl(auVar108,auVar97,auVar115);
      auVar89 = vfmadd132ps_fma(auVar95,auVar108,auVar108);
      auVar255 = ZEXT1664(auVar89);
      fVar207 = auVar89._0_4_ * auVar100._0_4_;
      fVar144 = auVar89._4_4_ * auVar100._4_4_;
      auVar59._4_4_ = fVar144;
      auVar59._0_4_ = fVar207;
      fVar242 = auVar89._8_4_ * auVar100._8_4_;
      auVar59._8_4_ = fVar242;
      fVar243 = auVar89._12_4_ * auVar100._12_4_;
      auVar59._12_4_ = fVar243;
      fVar244 = auVar100._16_4_ * 0.0;
      auVar59._16_4_ = fVar244;
      fVar220 = auVar100._20_4_ * 0.0;
      auVar59._20_4_ = fVar220;
      fVar221 = auVar100._24_4_ * 0.0;
      auVar59._24_4_ = fVar221;
      auVar59._28_4_ = auVar100._28_4_;
      uVar20 = vcmpps_avx512vl(auVar97,auVar109,1);
      bVar79 = (byte)uVar18 | (byte)uVar20;
      auVar95 = vblendmps_avx512vl(auVar59,auVar125);
      auVar129._0_4_ =
           (uint)(bVar79 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar108._0_4_;
      bVar84 = (bool)(bVar79 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar84 * auVar95._4_4_ | (uint)!bVar84 * auVar108._4_4_;
      bVar84 = (bool)(bVar79 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar84 * auVar95._8_4_ | (uint)!bVar84 * auVar108._8_4_;
      bVar84 = (bool)(bVar79 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar84 * auVar95._12_4_ | (uint)!bVar84 * auVar108._12_4_;
      bVar84 = (bool)(bVar79 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar84 * auVar95._16_4_ | (uint)!bVar84 * auVar108._16_4_;
      bVar84 = (bool)(bVar79 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar84 * auVar95._20_4_ | (uint)!bVar84 * auVar108._20_4_;
      bVar84 = (bool)(bVar79 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar84 * auVar95._24_4_ | (uint)!bVar84 * auVar108._24_4_;
      auVar129._28_4_ =
           (uint)(bVar79 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar108._28_4_;
      _local_5c0 = vmaxps_avx(auVar112,auVar129);
      auVar245 = ZEXT3264(_local_5c0);
      uVar20 = vcmpps_avx512vl(auVar97,auVar109,6);
      bVar79 = (byte)uVar18 | (byte)uVar20;
      auVar130._0_4_ =
           (uint)(bVar79 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar79 & 1) * (int)fVar207;
      bVar84 = (bool)(bVar79 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar84 * auVar113._4_4_ | (uint)!bVar84 * (int)fVar144;
      bVar84 = (bool)(bVar79 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar84 * auVar113._8_4_ | (uint)!bVar84 * (int)fVar242;
      bVar84 = (bool)(bVar79 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar84 * auVar113._12_4_ | (uint)!bVar84 * (int)fVar243;
      bVar84 = (bool)(bVar79 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar84 * auVar113._16_4_ | (uint)!bVar84 * (int)fVar244;
      bVar84 = (bool)(bVar79 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar84 * auVar113._20_4_ | (uint)!bVar84 * (int)fVar220;
      bVar84 = (bool)(bVar79 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar84 * auVar113._24_4_ | (uint)!bVar84 * (int)fVar221;
      auVar130._28_4_ =
           (uint)(bVar79 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar100._28_4_;
      local_300 = vminps_avx(auVar116,auVar130);
      auVar241 = ZEXT3264(local_300);
      auVar100 = _local_5c0;
      uVar18 = vcmpps_avx512vl(_local_5c0,local_300,2);
      bVar75 = bVar75 & 0x7f & (byte)uVar18;
      if (bVar75 == 0) goto LAB_01ca2099;
      auVar97 = vmaxps_avx(auVar118,local_900);
      auVar107 = vfmadd213ps_avx512vl(auVar107,auVar119,auVar101);
      auVar107 = vmulps_avx512vl(auVar98,auVar107);
      auVar108 = vfmadd213ps_avx512vl(local_660,auVar119,auVar101);
      fVar207 = auVar98._0_4_;
      fVar144 = auVar98._4_4_;
      auVar60._4_4_ = fVar144 * auVar108._4_4_;
      auVar60._0_4_ = fVar207 * auVar108._0_4_;
      fVar242 = auVar98._8_4_;
      auVar60._8_4_ = fVar242 * auVar108._8_4_;
      fVar243 = auVar98._12_4_;
      auVar60._12_4_ = fVar243 * auVar108._12_4_;
      fVar244 = auVar98._16_4_;
      auVar60._16_4_ = fVar244 * auVar108._16_4_;
      fVar220 = auVar98._20_4_;
      auVar60._20_4_ = fVar220 * auVar108._20_4_;
      fVar221 = auVar98._24_4_;
      auVar60._24_4_ = fVar221 * auVar108._24_4_;
      auVar60._28_4_ = auVar108._28_4_;
      auVar107 = vminps_avx512vl(auVar107,auVar115);
      auVar108 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar107 = vmaxps_avx(auVar107,ZEXT832(0) << 0x20);
      auVar109 = vminps_avx512vl(auVar60,auVar115);
      auVar61._4_4_ = (auVar107._4_4_ + 1.0) * 0.125;
      auVar61._0_4_ = (auVar107._0_4_ + 0.0) * 0.125;
      auVar61._8_4_ = (auVar107._8_4_ + 2.0) * 0.125;
      auVar61._12_4_ = (auVar107._12_4_ + 3.0) * 0.125;
      auVar61._16_4_ = (auVar107._16_4_ + 4.0) * 0.125;
      auVar61._20_4_ = (auVar107._20_4_ + 5.0) * 0.125;
      auVar61._24_4_ = (auVar107._24_4_ + 6.0) * 0.125;
      auVar61._28_4_ = auVar107._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar61,local_7a0,local_620);
      auVar107 = vmaxps_avx(auVar109,ZEXT832(0) << 0x20);
      auVar62._4_4_ = (auVar107._4_4_ + 1.0) * 0.125;
      auVar62._0_4_ = (auVar107._0_4_ + 0.0) * 0.125;
      auVar62._8_4_ = (auVar107._8_4_ + 2.0) * 0.125;
      auVar62._12_4_ = (auVar107._12_4_ + 3.0) * 0.125;
      auVar62._16_4_ = (auVar107._16_4_ + 4.0) * 0.125;
      auVar62._20_4_ = (auVar107._20_4_ + 5.0) * 0.125;
      auVar62._24_4_ = (auVar107._24_4_ + 6.0) * 0.125;
      auVar62._28_4_ = auVar107._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar62,local_7a0,local_620);
      auVar63._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar63._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar63._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar63._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar63._16_4_ = auVar97._16_4_ * auVar97._16_4_;
      auVar63._20_4_ = auVar97._20_4_ * auVar97._20_4_;
      auVar63._24_4_ = auVar97._24_4_ * auVar97._24_4_;
      auVar63._28_4_ = auVar97._28_4_;
      auVar107 = vsubps_avx(local_5a0,auVar63);
      auVar64._4_4_ = auVar107._4_4_ * (float)local_500._4_4_;
      auVar64._0_4_ = auVar107._0_4_ * (float)local_500._0_4_;
      auVar64._8_4_ = auVar107._8_4_ * fStack_4f8;
      auVar64._12_4_ = auVar107._12_4_ * fStack_4f4;
      auVar64._16_4_ = auVar107._16_4_ * fStack_4f0;
      auVar64._20_4_ = auVar107._20_4_ * fStack_4ec;
      auVar64._24_4_ = auVar107._24_4_ * fStack_4e8;
      auVar64._28_4_ = auVar97._28_4_;
      auVar97 = vsubps_avx(local_4e0,auVar64);
      uVar85 = vcmpps_avx512vl(auVar97,ZEXT832(0) << 0x20,5);
      auVar261 = ZEXT3264(local_6e0);
      auVar264 = ZEXT3264(local_700);
      auVar267 = ZEXT3264(local_720);
      auVar268 = ZEXT3264(local_740);
      auVar269 = ZEXT3264(local_7c0);
      if ((byte)uVar85 == 0) {
        uVar85 = 0;
        auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar255 = ZEXT864(0) << 0x20;
        auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar109 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar245 = ZEXT864(0) << 0x20;
        auVar131._8_4_ = 0x7f800000;
        auVar131._0_8_ = 0x7f8000007f800000;
        auVar131._12_4_ = 0x7f800000;
        auVar131._16_4_ = 0x7f800000;
        auVar131._20_4_ = 0x7f800000;
        auVar131._24_4_ = 0x7f800000;
        auVar131._28_4_ = 0x7f800000;
        auVar132._8_4_ = 0xff800000;
        auVar132._0_8_ = 0xff800000ff800000;
        auVar132._12_4_ = 0xff800000;
        auVar132._16_4_ = 0xff800000;
        auVar132._20_4_ = 0xff800000;
        auVar132._24_4_ = 0xff800000;
        auVar132._28_4_ = 0xff800000;
      }
      else {
        auVar90 = vxorps_avx512vl(auVar147,auVar147);
        uVar80 = vcmpps_avx512vl(auVar97,auVar118,5);
        auVar97 = vsqrtps_avx(auVar97);
        auVar108 = vfnmadd213ps_avx512vl(auVar121,local_400,auVar115);
        auVar95 = vfmadd132ps_avx512vl(auVar108,local_400,local_400);
        auVar108 = vsubps_avx(local_680,auVar97);
        auVar96 = vmulps_avx512vl(auVar108,auVar95);
        auVar97 = vsubps_avx512vl(auVar97,auVar117);
        auVar95 = vmulps_avx512vl(auVar97,auVar95);
        auVar97 = vfmadd213ps_avx512vl(auVar119,auVar96,auVar101);
        auVar65._4_4_ = fVar144 * auVar97._4_4_;
        auVar65._0_4_ = fVar207 * auVar97._0_4_;
        auVar65._8_4_ = fVar242 * auVar97._8_4_;
        auVar65._12_4_ = fVar243 * auVar97._12_4_;
        auVar65._16_4_ = fVar244 * auVar97._16_4_;
        auVar65._20_4_ = fVar220 * auVar97._20_4_;
        auVar65._24_4_ = fVar221 * auVar97._24_4_;
        auVar65._28_4_ = auVar109._28_4_;
        auVar97 = vmulps_avx512vl(local_340,auVar96);
        auVar108 = vmulps_avx512vl(local_640,auVar96);
        auVar72._4_4_ = uStack_3bc;
        auVar72._0_4_ = local_3c0;
        auVar72._8_4_ = uStack_3b8;
        auVar72._12_4_ = uStack_3b4;
        auVar72._16_4_ = uStack_3b0;
        auVar72._20_4_ = uStack_3ac;
        auVar72._24_4_ = uStack_3a8;
        auVar72._28_4_ = uStack_3a4;
        auVar110 = vmulps_avx512vl(auVar72,auVar96);
        auVar109 = vfmadd213ps_avx512vl(auVar102,auVar65,auVar104);
        auVar97 = vsubps_avx512vl(auVar97,auVar109);
        auVar109 = vfmadd213ps_avx512vl(auVar103,auVar65,auVar105);
        auVar109 = vsubps_avx512vl(auVar108,auVar109);
        auVar89 = vfmadd213ps_fma(auVar65,auVar99,auVar106);
        auVar108 = vsubps_avx(auVar110,ZEXT1632(auVar89));
        auVar245 = ZEXT3264(auVar108);
        auVar101 = vfmadd213ps_avx512vl(auVar119,auVar95,auVar101);
        auVar66._4_4_ = fVar144 * auVar101._4_4_;
        auVar66._0_4_ = fVar207 * auVar101._0_4_;
        auVar66._8_4_ = fVar242 * auVar101._8_4_;
        auVar66._12_4_ = fVar243 * auVar101._12_4_;
        auVar66._16_4_ = fVar244 * auVar101._16_4_;
        auVar66._20_4_ = fVar220 * auVar101._20_4_;
        auVar66._24_4_ = fVar221 * auVar101._24_4_;
        auVar66._28_4_ = auVar98._28_4_;
        auVar98 = vmulps_avx512vl(local_340,auVar95);
        auVar101 = vmulps_avx512vl(local_640,auVar95);
        auVar110 = vmulps_avx512vl(auVar72,auVar95);
        auVar89 = vfmadd213ps_fma(auVar102,auVar66,auVar104);
        auVar108 = vsubps_avx(auVar98,ZEXT1632(auVar89));
        auVar89 = vfmadd213ps_fma(auVar103,auVar66,auVar105);
        auVar98 = vsubps_avx(auVar101,ZEXT1632(auVar89));
        auVar89 = vfmadd213ps_fma(auVar99,auVar66,auVar106);
        auVar101 = vsubps_avx512vl(auVar110,ZEXT1632(auVar89));
        auVar255 = ZEXT3264(auVar101);
        auVar155._8_4_ = 0x7f800000;
        auVar155._0_8_ = 0x7f8000007f800000;
        auVar155._12_4_ = 0x7f800000;
        auVar155._16_4_ = 0x7f800000;
        auVar155._20_4_ = 0x7f800000;
        auVar155._24_4_ = 0x7f800000;
        auVar155._28_4_ = 0x7f800000;
        auVar101 = vblendmps_avx512vl(auVar155,auVar96);
        bVar84 = (bool)((byte)uVar80 & 1);
        auVar131._0_4_ = (uint)bVar84 * auVar101._0_4_ | (uint)!bVar84 * 0x7f800000;
        bVar84 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar84 * auVar101._4_4_ | (uint)!bVar84 * 0x7f800000;
        bVar84 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar84 * auVar101._8_4_ | (uint)!bVar84 * 0x7f800000;
        bVar84 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar84 * auVar101._12_4_ | (uint)!bVar84 * 0x7f800000;
        bVar84 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar131._16_4_ = (uint)bVar84 * auVar101._16_4_ | (uint)!bVar84 * 0x7f800000;
        bVar84 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar131._20_4_ = (uint)bVar84 * auVar101._20_4_ | (uint)!bVar84 * 0x7f800000;
        bVar84 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar131._24_4_ = (uint)bVar84 * auVar101._24_4_ | (uint)!bVar84 * 0x7f800000;
        bVar84 = SUB81(uVar80 >> 7,0);
        auVar131._28_4_ = (uint)bVar84 * auVar101._28_4_ | (uint)!bVar84 * 0x7f800000;
        auVar198._8_4_ = 0xff800000;
        auVar198._0_8_ = 0xff800000ff800000;
        auVar198._12_4_ = 0xff800000;
        auVar198._16_4_ = 0xff800000;
        auVar198._20_4_ = 0xff800000;
        auVar198._24_4_ = 0xff800000;
        auVar198._28_4_ = 0xff800000;
        auVar101 = vblendmps_avx512vl(auVar198,auVar95);
        bVar84 = (bool)((byte)uVar80 & 1);
        auVar132._0_4_ = (uint)bVar84 * auVar101._0_4_ | (uint)!bVar84 * -0x800000;
        bVar84 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar84 * auVar101._4_4_ | (uint)!bVar84 * -0x800000;
        bVar84 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar84 * auVar101._8_4_ | (uint)!bVar84 * -0x800000;
        bVar84 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar84 * auVar101._12_4_ | (uint)!bVar84 * -0x800000;
        bVar84 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar84 * auVar101._16_4_ | (uint)!bVar84 * -0x800000;
        bVar84 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar84 * auVar101._20_4_ | (uint)!bVar84 * -0x800000;
        bVar84 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar84 * auVar101._24_4_ | (uint)!bVar84 * -0x800000;
        bVar84 = SUB81(uVar80 >> 7,0);
        auVar132._28_4_ = (uint)bVar84 * auVar101._28_4_ | (uint)!bVar84 * -0x800000;
        auVar36._8_4_ = 0x36000000;
        auVar36._0_8_ = 0x3600000036000000;
        auVar36._12_4_ = 0x36000000;
        auVar36._16_4_ = 0x36000000;
        auVar36._20_4_ = 0x36000000;
        auVar36._24_4_ = 0x36000000;
        auVar36._28_4_ = 0x36000000;
        auVar101 = vmulps_avx512vl(_local_420,auVar36);
        uVar19 = vcmpps_avx512vl(auVar101,local_440,0xe);
        uVar80 = uVar80 & uVar19;
        bVar79 = (byte)uVar80;
        if (bVar79 != 0) {
          uVar19 = vcmpps_avx512vl(auVar107,ZEXT1632(auVar90),2);
          auVar237._8_4_ = 0x7f800000;
          auVar237._0_8_ = 0x7f8000007f800000;
          auVar237._12_4_ = 0x7f800000;
          auVar237._16_4_ = 0x7f800000;
          auVar237._20_4_ = 0x7f800000;
          auVar237._24_4_ = 0x7f800000;
          auVar237._28_4_ = 0x7f800000;
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
          auVar102 = vblendmps_avx512vl(auVar237,auVar251);
          bVar77 = (byte)uVar19;
          uVar86 = (uint)(bVar77 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar101._0_4_;
          bVar84 = (bool)((byte)(uVar19 >> 1) & 1);
          uVar137 = (uint)bVar84 * auVar102._4_4_ | (uint)!bVar84 * auVar101._4_4_;
          bVar84 = (bool)((byte)(uVar19 >> 2) & 1);
          uVar138 = (uint)bVar84 * auVar102._8_4_ | (uint)!bVar84 * auVar101._8_4_;
          bVar84 = (bool)((byte)(uVar19 >> 3) & 1);
          uVar139 = (uint)bVar84 * auVar102._12_4_ | (uint)!bVar84 * auVar101._12_4_;
          bVar84 = (bool)((byte)(uVar19 >> 4) & 1);
          uVar140 = (uint)bVar84 * auVar102._16_4_ | (uint)!bVar84 * auVar101._16_4_;
          bVar84 = (bool)((byte)(uVar19 >> 5) & 1);
          uVar141 = (uint)bVar84 * auVar102._20_4_ | (uint)!bVar84 * auVar101._20_4_;
          bVar84 = (bool)((byte)(uVar19 >> 6) & 1);
          uVar142 = (uint)bVar84 * auVar102._24_4_ | (uint)!bVar84 * auVar101._24_4_;
          bVar84 = SUB81(uVar19 >> 7,0);
          uVar143 = (uint)bVar84 * auVar102._28_4_ | (uint)!bVar84 * auVar101._28_4_;
          auVar131._0_4_ = (bVar79 & 1) * uVar86 | !(bool)(bVar79 & 1) * auVar131._0_4_;
          bVar84 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar131._4_4_ = bVar84 * uVar137 | !bVar84 * auVar131._4_4_;
          bVar84 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar131._8_4_ = bVar84 * uVar138 | !bVar84 * auVar131._8_4_;
          bVar84 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar131._12_4_ = bVar84 * uVar139 | !bVar84 * auVar131._12_4_;
          bVar84 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar131._16_4_ = bVar84 * uVar140 | !bVar84 * auVar131._16_4_;
          bVar84 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar131._20_4_ = bVar84 * uVar141 | !bVar84 * auVar131._20_4_;
          bVar84 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar131._24_4_ = bVar84 * uVar142 | !bVar84 * auVar131._24_4_;
          bVar84 = SUB81(uVar80 >> 7,0);
          auVar131._28_4_ = bVar84 * uVar143 | !bVar84 * auVar131._28_4_;
          auVar101 = vblendmps_avx512vl(auVar251,auVar237);
          bVar84 = (bool)((byte)(uVar19 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar19 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar19 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar19 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar19 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar19 >> 6) & 1);
          bVar14 = SUB81(uVar19 >> 7,0);
          auVar132._0_4_ =
               (uint)(bVar79 & 1) *
               ((uint)(bVar77 & 1) * auVar101._0_4_ | !(bool)(bVar77 & 1) * uVar86) |
               !(bool)(bVar79 & 1) * auVar132._0_4_;
          bVar8 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar132._4_4_ =
               (uint)bVar8 * ((uint)bVar84 * auVar101._4_4_ | !bVar84 * uVar137) |
               !bVar8 * auVar132._4_4_;
          bVar84 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar132._8_4_ =
               (uint)bVar84 * ((uint)bVar9 * auVar101._8_4_ | !bVar9 * uVar138) |
               !bVar84 * auVar132._8_4_;
          bVar84 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar132._12_4_ =
               (uint)bVar84 * ((uint)bVar10 * auVar101._12_4_ | !bVar10 * uVar139) |
               !bVar84 * auVar132._12_4_;
          bVar84 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar132._16_4_ =
               (uint)bVar84 * ((uint)bVar11 * auVar101._16_4_ | !bVar11 * uVar140) |
               !bVar84 * auVar132._16_4_;
          bVar84 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar132._20_4_ =
               (uint)bVar84 * ((uint)bVar12 * auVar101._20_4_ | !bVar12 * uVar141) |
               !bVar84 * auVar132._20_4_;
          bVar84 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar132._24_4_ =
               (uint)bVar84 * ((uint)bVar13 * auVar101._24_4_ | !bVar13 * uVar142) |
               !bVar84 * auVar132._24_4_;
          bVar84 = SUB81(uVar80 >> 7,0);
          auVar132._28_4_ =
               (uint)bVar84 * ((uint)bVar14 * auVar101._28_4_ | !bVar14 * uVar143) |
               !bVar84 * auVar132._28_4_;
          uVar85 = (ulong)(byte)((~bVar79 | bVar77) & (byte)uVar85);
        }
      }
      auVar263 = ZEXT3264(local_7e0);
      auVar257 = ZEXT3264(local_800);
      auVar260 = ZEXT3264(local_820);
      auVar262 = ZEXT3264(local_840);
      auVar266 = ZEXT3264(local_860);
      auVar270 = ZEXT3264(local_880);
      uVar146 = *(undefined4 *)&(ray->dir).field_0;
      auVar233._4_4_ = uVar146;
      auVar233._0_4_ = uVar146;
      auVar233._8_4_ = uVar146;
      auVar233._12_4_ = uVar146;
      auVar233._16_4_ = uVar146;
      auVar233._20_4_ = uVar146;
      auVar233._24_4_ = uVar146;
      auVar233._28_4_ = uVar146;
      uVar146 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar238._4_4_ = uVar146;
      auVar238._0_4_ = uVar146;
      auVar238._8_4_ = uVar146;
      auVar238._12_4_ = uVar146;
      auVar238._16_4_ = uVar146;
      auVar238._20_4_ = uVar146;
      auVar238._24_4_ = uVar146;
      auVar238._28_4_ = uVar146;
      fVar207 = (ray->dir).field_0.m128[2];
      auVar252 = ZEXT3264(CONCAT428(fVar207,CONCAT424(fVar207,CONCAT420(fVar207,CONCAT416(fVar207,
                                                  CONCAT412(fVar207,CONCAT48(fVar207,CONCAT44(
                                                  fVar207,fVar207))))))));
      auVar231._0_4_ = fVar207 * auVar255._0_4_;
      auVar231._4_4_ = fVar207 * auVar255._4_4_;
      auVar231._8_4_ = fVar207 * auVar255._8_4_;
      auVar231._12_4_ = fVar207 * auVar255._12_4_;
      auVar231._16_4_ = fVar207 * auVar255._16_4_;
      auVar231._20_4_ = fVar207 * auVar255._20_4_;
      auVar231._28_36_ = auVar255._28_36_;
      auVar231._24_4_ = fVar207 * auVar255._24_4_;
      auVar89 = vfmadd231ps_fma(auVar231._0_32_,auVar238,auVar98);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar233,auVar108);
      auVar247._8_4_ = 0x7fffffff;
      auVar247._0_8_ = 0x7fffffff7fffffff;
      auVar247._12_4_ = 0x7fffffff;
      auVar247._16_4_ = 0x7fffffff;
      auVar247._20_4_ = 0x7fffffff;
      auVar247._24_4_ = 0x7fffffff;
      auVar247._28_4_ = 0x7fffffff;
      auVar248 = ZEXT3264(auVar247);
      auVar98 = vandps_avx(auVar247,ZEXT1632(auVar89));
      auVar255 = ZEXT3264(_local_5c0);
      _local_2e0 = _local_5c0;
      auVar230._8_4_ = 0x3e99999a;
      auVar230._0_8_ = 0x3e99999a3e99999a;
      auVar230._12_4_ = 0x3e99999a;
      auVar230._16_4_ = 0x3e99999a;
      auVar230._20_4_ = 0x3e99999a;
      auVar230._24_4_ = 0x3e99999a;
      auVar230._28_4_ = 0x3e99999a;
      auVar231 = ZEXT3264(auVar230);
      uVar18 = vcmpps_avx512vl(auVar98,auVar230,1);
      local_912 = (short)uVar18;
      local_3e0 = vmaxps_avx(_local_5c0,auVar132);
      local_320 = local_3e0;
      auVar98 = vminps_avx(local_300,auVar131);
      uVar18 = vcmpps_avx512vl(_local_5c0,auVar98,2);
      bVar79 = (byte)uVar18 & bVar75;
      uVar20 = vcmpps_avx512vl(local_3e0,local_300,2);
      auVar258 = ZEXT3264(local_6a0);
      auVar259 = ZEXT3264(local_6c0);
      if ((bVar75 & ((byte)uVar20 | (byte)uVar18)) == 0) {
        auVar234 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar239 = ZEXT3264(_local_8e0);
      }
      else {
        auVar67._4_4_ = auVar245._4_4_ * fVar207;
        auVar67._0_4_ = auVar245._0_4_ * fVar207;
        auVar67._8_4_ = auVar245._8_4_ * fVar207;
        auVar67._12_4_ = auVar245._12_4_ * fVar207;
        auVar67._16_4_ = auVar245._16_4_ * fVar207;
        auVar67._20_4_ = auVar245._20_4_ * fVar207;
        auVar67._24_4_ = auVar245._24_4_ * fVar207;
        auVar67._28_4_ = auVar98._28_4_;
        auVar89 = vfmadd213ps_fma(auVar109,auVar238,auVar67);
        auVar89 = vfmadd213ps_fma(auVar97,auVar233,ZEXT1632(auVar89));
        auVar98 = vandps_avx(auVar247,ZEXT1632(auVar89));
        uVar18 = vcmpps_avx512vl(auVar98,auVar230,1);
        local_88c = (int)CONCAT71((int7)(uVar85 >> 8),~(byte)uVar85);
        bVar77 = (byte)uVar18 | ~(byte)uVar85;
        auVar158._8_4_ = 2;
        auVar158._0_8_ = 0x200000002;
        auVar158._12_4_ = 2;
        auVar158._16_4_ = 2;
        auVar158._20_4_ = 2;
        auVar158._24_4_ = 2;
        auVar158._28_4_ = 2;
        auVar37._8_4_ = 3;
        auVar37._0_8_ = 0x300000003;
        auVar37._12_4_ = 3;
        auVar37._16_4_ = 3;
        auVar37._20_4_ = 3;
        auVar37._24_4_ = 3;
        auVar37._28_4_ = 3;
        auVar98 = vpblendmd_avx512vl(auVar158,auVar37);
        local_2a0._0_4_ = (uint)(bVar77 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar77 & 1) * 2;
        bVar84 = (bool)(bVar77 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar84 * auVar98._4_4_ | (uint)!bVar84 * 2;
        bVar84 = (bool)(bVar77 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar84 * auVar98._8_4_ | (uint)!bVar84 * 2;
        bVar84 = (bool)(bVar77 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar84 * auVar98._12_4_ | (uint)!bVar84 * 2;
        bVar84 = (bool)(bVar77 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar84 * auVar98._16_4_ | (uint)!bVar84 * 2;
        bVar84 = (bool)(bVar77 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar84 * auVar98._20_4_ | (uint)!bVar84 * 2;
        bVar84 = (bool)(bVar77 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar84 * auVar98._24_4_ | (uint)!bVar84 * 2;
        local_2a0._28_4_ = (uint)(bVar77 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar77 >> 7) * 2;
        local_360 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_360,local_2a0,5);
        local_888 = (uint)bVar79;
        bVar79 = (byte)uVar18 & bVar79;
        _local_500 = auVar120;
        if (bVar79 == 0) {
          fVar207 = ray->tfar;
          auVar160._4_4_ = fVar207;
          auVar160._0_4_ = fVar207;
          auVar160._8_4_ = fVar207;
          auVar160._12_4_ = fVar207;
          auVar160._16_4_ = fVar207;
          auVar160._20_4_ = fVar207;
          auVar160._24_4_ = fVar207;
          auVar160._28_4_ = fVar207;
          auVar234 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar239 = ZEXT3264(_local_8e0);
        }
        else {
          auVar90 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar89 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar94 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar93 = vminps_avx(auVar90,auVar94);
          auVar90 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar94 = vmaxps_avx(auVar89,auVar90);
          auVar184._8_4_ = 0x7fffffff;
          auVar184._0_8_ = 0x7fffffff7fffffff;
          auVar184._12_4_ = 0x7fffffff;
          auVar89 = vandps_avx(auVar93,auVar184);
          auVar90 = vandps_avx(auVar94,auVar184);
          auVar89 = vmaxps_avx(auVar89,auVar90);
          auVar90 = vmovshdup_avx(auVar89);
          auVar90 = vmaxss_avx(auVar90,auVar89);
          auVar89 = vshufpd_avx(auVar89,auVar89,1);
          auVar89 = vmaxss_avx(auVar89,auVar90);
          fVar207 = auVar89._0_4_ * 1.9073486e-06;
          local_4b0 = vshufps_avx(auVar94,auVar94,0xff);
          local_3a0 = (float)local_5c0._0_4_ + (float)local_8e0._0_4_;
          fStack_39c = (float)local_5c0._4_4_ + (float)local_8e0._4_4_;
          fStack_398 = fStack_5b8 + fStack_8d8;
          fStack_394 = fStack_5b4 + fStack_8d4;
          fStack_390 = fStack_5b0 + fStack_8d0;
          fStack_38c = fStack_5ac + fStack_8cc;
          fStack_388 = fStack_5a8 + fStack_8c8;
          fStack_384 = fStack_5a4 + fStack_8c4;
          _local_5c0 = auVar100;
          do {
            auVar101 = local_900;
            auVar159._8_4_ = 0x7f800000;
            auVar159._0_8_ = 0x7f8000007f800000;
            auVar159._12_4_ = 0x7f800000;
            auVar159._16_4_ = 0x7f800000;
            auVar159._20_4_ = 0x7f800000;
            auVar159._24_4_ = 0x7f800000;
            auVar159._28_4_ = 0x7f800000;
            auVar100 = vblendmps_avx512vl(auVar159,_local_5c0);
            auVar134._0_4_ =
                 (uint)(bVar79 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 1 & 1);
            auVar134._4_4_ = (uint)bVar84 * auVar100._4_4_ | (uint)!bVar84 * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 2 & 1);
            auVar134._8_4_ = (uint)bVar84 * auVar100._8_4_ | (uint)!bVar84 * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 3 & 1);
            auVar134._12_4_ = (uint)bVar84 * auVar100._12_4_ | (uint)!bVar84 * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 4 & 1);
            auVar134._16_4_ = (uint)bVar84 * auVar100._16_4_ | (uint)!bVar84 * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 5 & 1);
            auVar134._20_4_ = (uint)bVar84 * auVar100._20_4_ | (uint)!bVar84 * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 6 & 1);
            auVar134._24_4_ = (uint)bVar84 * auVar100._24_4_ | (uint)!bVar84 * 0x7f800000;
            auVar134._28_4_ =
                 (uint)(bVar79 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
            auVar100 = vshufps_avx(auVar134,auVar134,0xb1);
            auVar100 = vminps_avx(auVar134,auVar100);
            auVar98 = vshufpd_avx(auVar100,auVar100,5);
            auVar100 = vminps_avx(auVar100,auVar98);
            auVar98 = vpermpd_avx2(auVar100,0x4e);
            auVar100 = vminps_avx(auVar100,auVar98);
            uVar18 = vcmpps_avx512vl(auVar134,auVar100,0);
            bVar76 = (byte)uVar18 & bVar79;
            bVar77 = bVar79;
            if (bVar76 != 0) {
              bVar77 = bVar76;
            }
            iVar22 = 0;
            for (uVar86 = (uint)bVar77; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            aVar2 = (ray->dir).field_0;
            local_4e0._0_16_ = (undefined1  [16])aVar2;
            auVar89 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar89._0_4_ < 0.0) {
              local_900[1] = 0;
              local_900[0] = bVar79;
              local_900._2_30_ = auVar101._2_30_;
              local_620._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar22 << 2)));
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar22 << 2)));
              fVar144 = sqrtf(auVar89._0_4_);
              bVar79 = local_900[0];
              auVar89 = local_7a0._0_16_;
              auVar90 = local_620._0_16_;
            }
            else {
              auVar89 = vsqrtss_avx(auVar89,auVar89);
              fVar144 = auVar89._0_4_;
              auVar89 = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar22 << 2)));
              auVar90 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar22 << 2)));
            }
            auVar89 = vinsertps_avx(auVar89,auVar90,0x10);
            auVar245 = ZEXT1664(auVar89);
            bVar84 = true;
            uVar85 = 0;
            do {
              uVar146 = auVar245._0_4_;
              auVar149._4_4_ = uVar146;
              auVar149._0_4_ = uVar146;
              auVar149._8_4_ = uVar146;
              auVar149._12_4_ = uVar146;
              auVar90 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_4e0._0_16_);
              _local_500 = auVar245._0_16_;
              auVar89 = vmovshdup_avx(auVar245._0_16_);
              fVar221 = auVar89._0_4_;
              fVar220 = 1.0 - fVar221;
              fVar244 = fVar220 * fVar220 * fVar220;
              fVar242 = fVar221 * fVar221;
              fVar167 = fVar242 * fVar221;
              auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                        ZEXT416((uint)fVar167));
              fVar243 = fVar221 * fVar220;
              local_620._0_16_ = ZEXT416((uint)fVar220);
              local_900._0_16_ = auVar89;
              auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * fVar221 * 6.0)),
                                        ZEXT416((uint)(fVar243 * fVar220)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar167),
                                        ZEXT416((uint)fVar244));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * fVar220 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar243 * fVar221)));
              fVar244 = fVar244 * 0.16666667;
              fVar220 = (auVar94._0_4_ + auVar93._0_4_) * 0.16666667;
              fVar221 = (auVar89._0_4_ + auVar87._0_4_) * 0.16666667;
              fVar167 = fVar167 * 0.16666667;
              auVar185._0_4_ = fVar167 * (float)local_580._0_4_;
              auVar185._4_4_ = fVar167 * (float)local_580._4_4_;
              auVar185._8_4_ = fVar167 * fStack_578;
              auVar185._12_4_ = fVar167 * fStack_574;
              auVar222._4_4_ = fVar221;
              auVar222._0_4_ = fVar221;
              auVar222._8_4_ = fVar221;
              auVar222._12_4_ = fVar221;
              auVar89 = vfmadd132ps_fma(auVar222,auVar185,local_540._0_16_);
              auVar186._4_4_ = fVar220;
              auVar186._0_4_ = fVar220;
              auVar186._8_4_ = fVar220;
              auVar186._12_4_ = fVar220;
              auVar89 = vfmadd132ps_fma(auVar186,auVar89,local_560._0_16_);
              auVar169._4_4_ = fVar244;
              auVar169._0_4_ = fVar244;
              auVar169._8_4_ = fVar244;
              auVar169._12_4_ = fVar244;
              auVar89 = vfmadd132ps_fma(auVar169,auVar89,local_520._0_16_);
              local_400._0_16_ = auVar89;
              auVar89 = vsubps_avx(auVar90,auVar89);
              local_7a0._0_16_ = auVar89;
              auVar89 = vdpps_avx(auVar89,auVar89,0x7f);
              local_5a0._0_16_ = auVar89;
              if (auVar89._0_4_ < 0.0) {
                local_660._0_4_ = fVar242;
                local_680._0_4_ = fVar243;
                auVar252._0_4_ = sqrtf(auVar89._0_4_);
                auVar252._4_60_ = extraout_var;
                auVar89 = auVar252._0_16_;
                fVar243 = (float)local_680._0_4_;
              }
              else {
                auVar89 = vsqrtss_avx(auVar89,auVar89);
                local_660._0_4_ = fVar242;
              }
              local_420._4_4_ = local_620._0_4_;
              local_420._0_4_ = local_420._4_4_;
              fStack_418 = (float)local_420._4_4_;
              fStack_414 = (float)local_420._4_4_;
              auVar94 = vfnmsub213ss_fma(local_900._0_16_,local_900._0_16_,
                                         ZEXT416((uint)(fVar243 * 4.0)));
              auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * 4.0)),local_620._0_16_,
                                        local_620._0_16_);
              fVar242 = (float)local_420._4_4_ * -(float)local_420._4_4_ * 0.5;
              fVar243 = auVar94._0_4_ * 0.5;
              fVar244 = auVar90._0_4_ * 0.5;
              local_660._0_4_ = (float)local_660._0_4_ * 0.5;
              auVar208._0_4_ = (float)local_660._0_4_ * (float)local_580._0_4_;
              auVar208._4_4_ = (float)local_660._0_4_ * (float)local_580._4_4_;
              auVar208._8_4_ = (float)local_660._0_4_ * fStack_578;
              auVar208._12_4_ = (float)local_660._0_4_ * fStack_574;
              auVar170._4_4_ = fVar244;
              auVar170._0_4_ = fVar244;
              auVar170._8_4_ = fVar244;
              auVar170._12_4_ = fVar244;
              auVar90 = vfmadd132ps_fma(auVar170,auVar208,local_540._0_16_);
              auVar187._4_4_ = fVar243;
              auVar187._0_4_ = fVar243;
              auVar187._8_4_ = fVar243;
              auVar187._12_4_ = fVar243;
              auVar90 = vfmadd132ps_fma(auVar187,auVar90,local_560._0_16_);
              auVar253._4_4_ = fVar242;
              auVar253._0_4_ = fVar242;
              auVar253._8_4_ = fVar242;
              auVar253._12_4_ = fVar242;
              local_660._0_16_ = vfmadd132ps_fma(auVar253,auVar90,local_520._0_16_);
              local_440._0_16_ = vdpps_avx(local_660._0_16_,local_660._0_16_,0x7f);
              auVar68._12_4_ = 0;
              auVar68._0_12_ = ZEXT812(0);
              fVar242 = local_440._0_4_;
              local_8a0 = vrsqrt14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar242));
              local_8b0 = local_8a0._0_4_ * 1.5;
              local_470 = vrcp14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar242));
              auVar90 = vfnmadd213ss_fma(local_470,local_440._0_16_,ZEXT416(0x40000000));
              local_680._0_4_ = auVar89._0_4_;
              if (fVar242 < -fVar242) {
                fVar243 = sqrtf(fVar242);
                auVar89 = ZEXT416((uint)local_680._0_4_);
                auVar94 = local_660._0_16_;
              }
              else {
                auVar94 = vsqrtss_avx(local_440._0_16_,local_440._0_16_);
                fVar243 = auVar94._0_4_;
                auVar94 = local_660._0_16_;
              }
              fVar244 = local_8a0._0_4_;
              fVar242 = local_8b0 + fVar242 * -0.5 * fVar244 * fVar244 * fVar244;
              local_8a0._0_4_ = auVar94._0_4_ * fVar242;
              local_8a0._4_4_ = auVar94._4_4_ * fVar242;
              local_8a0._8_4_ = auVar94._8_4_ * fVar242;
              local_8a0._12_4_ = auVar94._12_4_ * fVar242;
              auVar93 = vdpps_avx(local_7a0._0_16_,local_8a0,0x7f);
              fVar220 = auVar89._0_4_;
              auVar150._0_4_ = auVar93._0_4_ * auVar93._0_4_;
              auVar150._4_4_ = auVar93._4_4_ * auVar93._4_4_;
              auVar150._8_4_ = auVar93._8_4_ * auVar93._8_4_;
              auVar150._12_4_ = auVar93._12_4_ * auVar93._12_4_;
              auVar87 = vsubps_avx(local_5a0._0_16_,auVar150);
              fVar244 = auVar87._0_4_;
              auVar171._4_12_ = ZEXT812(0) << 0x20;
              auVar171._0_4_ = fVar244;
              auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              auVar88 = vmulss_avx512f(auVar91,ZEXT416(0x3fc00000));
              local_8b0 = fVar244 * -0.5;
              if (fVar244 < 0.0) {
                local_4a0._4_4_ = fVar242;
                local_4a0._0_4_ = fVar242;
                fStack_498 = fVar242;
                fStack_494 = fVar242;
                local_490 = auVar91;
                local_480 = auVar93;
                fVar244 = sqrtf(fVar244);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar89 = ZEXT416((uint)local_680._0_4_);
                auVar91 = local_490;
                auVar94 = local_660._0_16_;
                auVar93 = local_480;
                fVar242 = (float)local_4a0._0_4_;
                fVar221 = (float)local_4a0._4_4_;
                fVar167 = fStack_498;
                fVar206 = fStack_494;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar244 = auVar87._0_4_;
                fVar221 = fVar242;
                fVar167 = fVar242;
                fVar206 = fVar242;
              }
              auVar255 = ZEXT1664(auVar94);
              auVar252 = ZEXT1664(local_5a0._0_16_);
              auVar248 = ZEXT1664(local_7a0._0_16_);
              auVar265 = ZEXT3264(local_640);
              auVar263 = ZEXT3264(local_7e0);
              auVar257 = ZEXT3264(local_800);
              auVar258 = ZEXT3264(local_6a0);
              auVar259 = ZEXT3264(local_6c0);
              auVar260 = ZEXT3264(local_820);
              auVar261 = ZEXT3264(local_6e0);
              auVar262 = ZEXT3264(local_840);
              auVar264 = ZEXT3264(local_700);
              auVar266 = ZEXT3264(local_860);
              auVar267 = ZEXT3264(local_720);
              auVar268 = ZEXT3264(local_740);
              auVar269 = ZEXT3264(local_7c0);
              auVar270 = ZEXT3264(local_880);
              auVar246 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_620._0_16_,
                                         local_900._0_16_);
              auVar4 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                       local_620._0_16_);
              auVar87 = vshufps_avx(_local_500,_local_500,0x55);
              auVar188._0_4_ = auVar87._0_4_ * (float)local_580._0_4_;
              auVar188._4_4_ = auVar87._4_4_ * (float)local_580._4_4_;
              auVar188._8_4_ = auVar87._8_4_ * fStack_578;
              auVar188._12_4_ = auVar87._12_4_ * fStack_574;
              auVar209._0_4_ = auVar4._0_4_;
              auVar209._4_4_ = auVar209._0_4_;
              auVar209._8_4_ = auVar209._0_4_;
              auVar209._12_4_ = auVar209._0_4_;
              auVar87 = vfmadd132ps_fma(auVar209,auVar188,local_540._0_16_);
              auVar172._0_4_ = auVar246._0_4_;
              auVar172._4_4_ = auVar172._0_4_;
              auVar172._8_4_ = auVar172._0_4_;
              auVar172._12_4_ = auVar172._0_4_;
              auVar87 = vfmadd132ps_fma(auVar172,auVar87,local_560._0_16_);
              auVar87 = vfmadd132ps_fma(_local_420,auVar87,local_520._0_16_);
              auVar173._0_4_ = auVar87._0_4_ * (float)local_440._0_4_;
              auVar173._4_4_ = auVar87._4_4_ * (float)local_440._0_4_;
              auVar173._8_4_ = auVar87._8_4_ * (float)local_440._0_4_;
              auVar173._12_4_ = auVar87._12_4_ * (float)local_440._0_4_;
              auVar87 = vdpps_avx(auVar94,auVar87,0x7f);
              fVar183 = auVar87._0_4_;
              auVar189._0_4_ = auVar94._0_4_ * fVar183;
              auVar189._4_4_ = auVar94._4_4_ * fVar183;
              auVar189._8_4_ = auVar94._8_4_ * fVar183;
              auVar189._12_4_ = auVar94._12_4_ * fVar183;
              auVar87 = vsubps_avx(auVar173,auVar189);
              fVar183 = auVar90._0_4_ * (float)local_470._0_4_;
              auVar246 = vmaxss_avx(ZEXT416((uint)fVar207),
                                    ZEXT416((uint)(local_500._0_4_ * fVar144 * 1.9073486e-06)));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar92 = vxorps_avx512vl(auVar94,auVar23);
              auVar190._0_4_ = fVar242 * auVar87._0_4_ * fVar183;
              auVar190._4_4_ = fVar221 * auVar87._4_4_ * fVar183;
              auVar190._8_4_ = fVar167 * auVar87._8_4_ * fVar183;
              auVar190._12_4_ = fVar206 * auVar87._12_4_ * fVar183;
              auVar90 = vdpps_avx(auVar92,local_8a0,0x7f);
              auVar87 = vfmadd213ss_fma(auVar89,ZEXT416((uint)fVar207),auVar246);
              auVar89 = vdpps_avx(local_7a0._0_16_,auVar190,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar220 + 1.0)),
                                       ZEXT416((uint)(fVar207 / fVar243)),auVar87);
              fVar242 = auVar90._0_4_ + auVar89._0_4_;
              auVar89 = vdpps_avx(local_4e0._0_16_,local_8a0,0x7f);
              auVar90 = vdpps_avx(local_7a0._0_16_,auVar92,0x7f);
              fVar243 = auVar91._0_4_;
              auVar92 = vaddss_avx512f(auVar88,ZEXT416((uint)(fVar243 * local_8b0 *
                                                             fVar243 * fVar243)));
              auVar87 = vdpps_avx(local_7a0._0_16_,local_4e0._0_16_,0x7f);
              auVar88 = vfnmadd231ss_fma(auVar90,auVar93,ZEXT416((uint)fVar242));
              auVar87 = vfnmadd231ss_fma(auVar87,auVar93,auVar89);
              auVar90 = vpermilps_avx(local_400._0_16_,0xff);
              fVar244 = fVar244 - auVar90._0_4_;
              auVar91 = vshufps_avx(auVar94,auVar94,0xff);
              auVar90 = vfmsub213ss_fma(auVar88,auVar92,auVar91);
              auVar235._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
              auVar235._8_4_ = auVar90._8_4_ ^ 0x80000000;
              auVar235._12_4_ = auVar90._12_4_ ^ 0x80000000;
              auVar87 = ZEXT416((uint)(auVar87._0_4_ * auVar92._0_4_));
              auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar89._0_4_ * auVar90._0_4_)),
                                        ZEXT416((uint)fVar242),auVar87);
              auVar90 = vinsertps_avx(auVar235,auVar87,0x1c);
              auVar228._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
              auVar228._8_4_ = auVar89._8_4_ ^ 0x80000000;
              auVar228._12_4_ = auVar89._12_4_ ^ 0x80000000;
              auVar87 = vinsertps_avx(ZEXT416((uint)fVar242),auVar228,0x10);
              auVar210._0_4_ = auVar88._0_4_;
              auVar210._4_4_ = auVar210._0_4_;
              auVar210._8_4_ = auVar210._0_4_;
              auVar210._12_4_ = auVar210._0_4_;
              auVar89 = vdivps_avx(auVar90,auVar210);
              auVar90 = vdivps_avx(auVar87,auVar210);
              fVar242 = auVar93._0_4_;
              auVar231 = ZEXT1664(CONCAT412(fVar244,CONCAT48(fVar244,CONCAT44(fVar244,fVar244))));
              auVar211._0_4_ = fVar242 * auVar89._0_4_ + fVar244 * auVar90._0_4_;
              auVar211._4_4_ = fVar242 * auVar89._4_4_ + fVar244 * auVar90._4_4_;
              auVar211._8_4_ = fVar242 * auVar89._8_4_ + fVar244 * auVar90._8_4_;
              auVar211._12_4_ = fVar242 * auVar89._12_4_ + fVar244 * auVar90._12_4_;
              auVar89 = vsubps_avx(_local_500,auVar211);
              auVar245 = ZEXT1664(auVar89);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar90 = vandps_avx512vl(auVar93,auVar24);
              if (auVar90._0_4_ < auVar4._0_4_) {
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(auVar4._0_4_ + auVar246._0_4_)),local_4b0,
                                          ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar93 = vandps_avx512vl(ZEXT416((uint)fVar244),auVar25);
                if (auVar93._0_4_ < auVar90._0_4_) {
                  fVar144 = auVar89._0_4_ + (float)local_4c0._0_4_;
                  bVar76 = 0;
                  bVar77 = 0;
                  if (fVar144 < (ray->org).field_0.m128[3]) goto LAB_01ca2acf;
                  auVar234 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  auVar239 = ZEXT3264(_local_8e0);
                  if (fVar144 <= ray->tfar) {
                    auVar90 = vmovshdup_avx(auVar89);
                    bVar76 = 0;
                    fVar242 = auVar90._0_4_;
                    if ((0.0 <= fVar242) && (fVar242 <= 1.0)) {
                      auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5a0._0_4_)
                                                  );
                      fVar244 = auVar90._0_4_;
                      fVar243 = local_5a0._0_4_ * -0.5;
                      auVar231 = ZEXT464((uint)fVar243);
                      pGVar6 = (local_910->scene->geometries).items[local_908].ptr;
                      if ((pGVar6->mask & ray->mask) == 0) {
                        bVar76 = 0;
                      }
                      else if ((local_910->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar76 = 1, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_900._0_4_ = ray->tfar;
                        fVar243 = fVar244 * 1.5 + fVar243 * fVar244 * fVar244 * fVar244;
                        auVar212._0_4_ = local_7a0._0_4_ * fVar243;
                        auVar212._4_4_ = local_7a0._4_4_ * fVar243;
                        auVar212._8_4_ = local_7a0._8_4_ * fVar243;
                        auVar212._12_4_ = local_7a0._12_4_ * fVar243;
                        auVar91 = vfmadd213ps_fma(auVar91,auVar212,auVar94);
                        auVar90 = vshufps_avx(auVar212,auVar212,0xc9);
                        auVar93 = vshufps_avx(auVar94,auVar94,0xc9);
                        auVar213._0_4_ = auVar212._0_4_ * auVar93._0_4_;
                        auVar213._4_4_ = auVar212._4_4_ * auVar93._4_4_;
                        auVar213._8_4_ = auVar212._8_4_ * auVar93._8_4_;
                        auVar213._12_4_ = auVar212._12_4_ * auVar93._12_4_;
                        auVar87 = vfmsub231ps_fma(auVar213,auVar94,auVar90);
                        auVar90 = vshufps_avx(auVar87,auVar87,0xc9);
                        auVar93 = vshufps_avx(auVar91,auVar91,0xc9);
                        auVar231 = ZEXT1664(auVar93);
                        auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                        auVar151._0_4_ = auVar91._0_4_ * auVar87._0_4_;
                        auVar151._4_4_ = auVar91._4_4_ * auVar87._4_4_;
                        auVar151._8_4_ = auVar91._8_4_ * auVar87._8_4_;
                        auVar151._12_4_ = auVar91._12_4_ * auVar87._12_4_;
                        auVar87 = vfmsub231ps_fma(auVar151,auVar90,auVar93);
                        auVar90 = vshufps_avx(auVar87,auVar87,0xe9);
                        local_5f0 = vmovlps_avx(auVar90);
                        local_5e8 = auVar87._0_4_;
                        local_5e4 = fVar242;
                        local_5e0 = 0;
                        local_5dc = uVar1;
                        local_5d8 = (int)local_908;
                        local_5d4 = local_910->user->instID[0];
                        local_5d0 = local_910->user->instPrimID[0];
                        ray->tfar = fVar144;
                        local_918 = -1;
                        local_770.valid = &local_918;
                        local_770.geometryUserPtr = pGVar6->userPtr;
                        local_770.context = local_910->user;
                        local_770.ray = (RTCRayN *)ray;
                        local_770.hit = (RTCHitN *)&local_5f0;
                        local_770.N = 1;
                        if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01ca2ce1:
                          p_Var7 = local_910->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((local_910->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                               != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar231 = ZEXT1664(auVar231._0_16_);
                            auVar245 = ZEXT1664(auVar245._0_16_);
                            auVar248 = ZEXT1664(auVar248._0_16_);
                            auVar252 = ZEXT1664(auVar252._0_16_);
                            auVar255 = ZEXT1664(auVar255._0_16_);
                            (*p_Var7)(&local_770);
                            if (*local_770.valid == 0) goto LAB_01ca2d2e;
                          }
                          bVar76 = 1;
                        }
                        else {
                          auVar231 = ZEXT1664(auVar93);
                          auVar245 = ZEXT1664(auVar89);
                          auVar248 = ZEXT1664(local_7a0._0_16_);
                          auVar252 = ZEXT1664(local_5a0._0_16_);
                          auVar255 = ZEXT1664(auVar94);
                          (*pGVar6->occlusionFilterN)(&local_770);
                          if (*local_770.valid != 0) goto LAB_01ca2ce1;
LAB_01ca2d2e:
                          ray->tfar = (float)local_900._0_4_;
                          bVar76 = 0;
                        }
                        auVar234 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        auVar239 = ZEXT3264(_local_8e0);
                        auVar265 = ZEXT3264(local_640);
                        auVar263 = ZEXT3264(local_7e0);
                        auVar257 = ZEXT3264(local_800);
                        auVar258 = ZEXT3264(local_6a0);
                        auVar259 = ZEXT3264(local_6c0);
                        auVar260 = ZEXT3264(local_820);
                        auVar261 = ZEXT3264(local_6e0);
                        auVar262 = ZEXT3264(local_840);
                        auVar264 = ZEXT3264(local_700);
                        auVar266 = ZEXT3264(local_860);
                        auVar267 = ZEXT3264(local_720);
                        auVar268 = ZEXT3264(local_740);
                        auVar269 = ZEXT3264(local_7c0);
                        auVar270 = ZEXT3264(local_880);
                      }
                    }
                  }
                  goto LAB_01ca2ae1;
                }
              }
              bVar84 = uVar85 < 4;
              uVar85 = uVar85 + 1;
            } while (uVar85 != 5);
            bVar84 = false;
            bVar77 = 5;
LAB_01ca2acf:
            bVar76 = bVar77;
            auVar234 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar239 = ZEXT3264(_local_8e0);
LAB_01ca2ae1:
            bVar83 = (bool)(bVar83 | bVar84 & bVar76);
            fVar144 = ray->tfar;
            auVar160._4_4_ = fVar144;
            auVar160._0_4_ = fVar144;
            auVar160._8_4_ = fVar144;
            auVar160._12_4_ = fVar144;
            auVar160._16_4_ = fVar144;
            auVar160._20_4_ = fVar144;
            auVar160._24_4_ = fVar144;
            auVar160._28_4_ = fVar144;
            auVar73._4_4_ = fStack_39c;
            auVar73._0_4_ = local_3a0;
            auVar73._8_4_ = fStack_398;
            auVar73._12_4_ = fStack_394;
            auVar73._16_4_ = fStack_390;
            auVar73._20_4_ = fStack_38c;
            auVar73._24_4_ = fStack_388;
            auVar73._28_4_ = fStack_384;
            uVar18 = vcmpps_avx512vl(auVar160,auVar73,0xd);
            bVar79 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar79 & (byte)uVar18;
          } while (bVar79 != 0);
        }
        auVar241 = ZEXT3264(local_320);
        bVar79 = (byte)local_912 | (byte)local_88c;
        auVar180._0_4_ = auVar239._0_4_ + local_3e0._0_4_;
        auVar180._4_4_ = auVar239._4_4_ + local_3e0._4_4_;
        auVar180._8_4_ = auVar239._8_4_ + local_3e0._8_4_;
        auVar180._12_4_ = auVar239._12_4_ + local_3e0._12_4_;
        auVar180._16_4_ = auVar239._16_4_ + local_3e0._16_4_;
        auVar180._20_4_ = auVar239._20_4_ + local_3e0._20_4_;
        auVar180._24_4_ = auVar239._24_4_ + local_3e0._24_4_;
        auVar180._28_4_ = auVar239._28_4_ + local_3e0._28_4_;
        uVar18 = vcmpps_avx512vl(auVar180,auVar160,2);
        bVar75 = (byte)uVar20 & bVar75 & (byte)uVar18;
        auVar181._8_4_ = 2;
        auVar181._0_8_ = 0x200000002;
        auVar181._12_4_ = 2;
        auVar181._16_4_ = 2;
        auVar181._20_4_ = 2;
        auVar181._24_4_ = 2;
        auVar181._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar100 = vpblendmd_avx512vl(auVar181,auVar38);
        local_3e0._0_4_ = (uint)(bVar79 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
        bVar84 = (bool)(bVar79 >> 1 & 1);
        local_3e0._4_4_ = (uint)bVar84 * auVar100._4_4_ | (uint)!bVar84 * 2;
        bVar84 = (bool)(bVar79 >> 2 & 1);
        local_3e0._8_4_ = (uint)bVar84 * auVar100._8_4_ | (uint)!bVar84 * 2;
        bVar84 = (bool)(bVar79 >> 3 & 1);
        local_3e0._12_4_ = (uint)bVar84 * auVar100._12_4_ | (uint)!bVar84 * 2;
        bVar84 = (bool)(bVar79 >> 4 & 1);
        local_3e0._16_4_ = (uint)bVar84 * auVar100._16_4_ | (uint)!bVar84 * 2;
        bVar84 = (bool)(bVar79 >> 5 & 1);
        local_3e0._20_4_ = (uint)bVar84 * auVar100._20_4_ | (uint)!bVar84 * 2;
        bVar84 = (bool)(bVar79 >> 6 & 1);
        local_3e0._24_4_ = (uint)bVar84 * auVar100._24_4_ | (uint)!bVar84 * 2;
        local_3e0._28_4_ = (uint)(bVar79 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2;
        uVar18 = vpcmpd_avx512vl(local_360,local_3e0,5);
        bVar79 = (byte)uVar18 & bVar75;
        if (bVar79 != 0) {
          auVar90 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar89 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar94 = vminps_avx(local_540._0_16_,local_580._0_16_);
          auVar93 = vminps_avx(auVar90,auVar94);
          auVar90 = vmaxps_avx(local_540._0_16_,local_580._0_16_);
          auVar94 = vmaxps_avx(auVar89,auVar90);
          auVar191._8_4_ = 0x7fffffff;
          auVar191._0_8_ = 0x7fffffff7fffffff;
          auVar191._12_4_ = 0x7fffffff;
          auVar89 = vandps_avx(auVar93,auVar191);
          auVar90 = vandps_avx(auVar94,auVar191);
          auVar89 = vmaxps_avx(auVar89,auVar90);
          auVar90 = vmovshdup_avx(auVar89);
          auVar90 = vmaxss_avx(auVar90,auVar89);
          auVar89 = vshufpd_avx(auVar89,auVar89,1);
          auVar89 = vmaxss_avx(auVar89,auVar90);
          fVar207 = auVar89._0_4_ * 1.9073486e-06;
          local_4b0 = vshufps_avx(auVar94,auVar94,0xff);
          local_3a0 = local_320._0_4_ + auVar239._0_4_;
          fStack_39c = local_320._4_4_ + auVar239._4_4_;
          fStack_398 = local_320._8_4_ + auVar239._8_4_;
          fStack_394 = local_320._12_4_ + auVar239._12_4_;
          fStack_390 = local_320._16_4_ + auVar239._16_4_;
          fStack_38c = local_320._20_4_ + auVar239._20_4_;
          fStack_388 = local_320._24_4_ + auVar239._24_4_;
          fStack_384 = local_320._28_4_ + auVar239._28_4_;
          _local_5c0 = local_320;
          do {
            auVar101 = local_900;
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar100 = vblendmps_avx512vl(auVar161,auVar241._0_32_);
            auVar135._0_4_ =
                 (uint)(bVar79 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 1 & 1);
            auVar135._4_4_ = (uint)bVar84 * auVar100._4_4_ | (uint)!bVar84 * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 2 & 1);
            auVar135._8_4_ = (uint)bVar84 * auVar100._8_4_ | (uint)!bVar84 * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 3 & 1);
            auVar135._12_4_ = (uint)bVar84 * auVar100._12_4_ | (uint)!bVar84 * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 4 & 1);
            auVar135._16_4_ = (uint)bVar84 * auVar100._16_4_ | (uint)!bVar84 * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 5 & 1);
            auVar135._20_4_ = (uint)bVar84 * auVar100._20_4_ | (uint)!bVar84 * 0x7f800000;
            bVar84 = (bool)(bVar79 >> 6 & 1);
            auVar135._24_4_ = (uint)bVar84 * auVar100._24_4_ | (uint)!bVar84 * 0x7f800000;
            auVar135._28_4_ =
                 (uint)(bVar79 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
            auVar100 = vshufps_avx(auVar135,auVar135,0xb1);
            auVar100 = vminps_avx(auVar135,auVar100);
            auVar98 = vshufpd_avx(auVar100,auVar100,5);
            auVar100 = vminps_avx(auVar100,auVar98);
            auVar98 = vpermpd_avx2(auVar100,0x4e);
            auVar100 = vminps_avx(auVar100,auVar98);
            uVar18 = vcmpps_avx512vl(auVar135,auVar100,0);
            bVar76 = (byte)uVar18 & bVar79;
            bVar77 = bVar79;
            if (bVar76 != 0) {
              bVar77 = bVar76;
            }
            iVar22 = 0;
            for (uVar86 = (uint)bVar77; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
              iVar22 = iVar22 + 1;
            }
            aVar2 = (ray->dir).field_0;
            local_4e0._0_16_ = (undefined1  [16])aVar2;
            auVar89 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar89._0_4_ < 0.0) {
              local_900[1] = 0;
              local_900[0] = bVar79;
              local_900._2_30_ = auVar101._2_30_;
              local_620._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar22 << 2)));
              local_7a0._0_16_ = ZEXT416(*(uint *)(local_300 + (uint)(iVar22 << 2)));
              fVar144 = sqrtf(auVar89._0_4_);
              bVar79 = local_900[0];
              auVar89 = local_7a0._0_16_;
              auVar90 = local_620._0_16_;
            }
            else {
              auVar89 = vsqrtss_avx(auVar89,auVar89);
              fVar144 = auVar89._0_4_;
              auVar89 = ZEXT416(*(uint *)(local_300 + (uint)(iVar22 << 2)));
              auVar90 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar22 << 2)));
            }
            auVar89 = vinsertps_avx(auVar89,auVar90,0x10);
            auVar245 = ZEXT1664(auVar89);
            bVar84 = true;
            uVar85 = 0;
            do {
              uVar146 = auVar245._0_4_;
              auVar152._4_4_ = uVar146;
              auVar152._0_4_ = uVar146;
              auVar152._8_4_ = uVar146;
              auVar152._12_4_ = uVar146;
              auVar90 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_4e0._0_16_);
              _local_500 = auVar245._0_16_;
              auVar89 = vmovshdup_avx(auVar245._0_16_);
              fVar221 = auVar89._0_4_;
              fVar220 = 1.0 - fVar221;
              fVar244 = fVar220 * fVar220 * fVar220;
              fVar242 = fVar221 * fVar221;
              fVar167 = fVar242 * fVar221;
              auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                        ZEXT416((uint)fVar167));
              fVar243 = fVar221 * fVar220;
              local_620._0_16_ = ZEXT416((uint)fVar220);
              local_900._0_16_ = auVar89;
              auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * fVar221 * 6.0)),
                                        ZEXT416((uint)(fVar243 * fVar220)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar167),
                                        ZEXT416((uint)fVar244));
              auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * fVar220 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar243 * fVar221)));
              fVar244 = fVar244 * 0.16666667;
              fVar220 = (auVar94._0_4_ + auVar93._0_4_) * 0.16666667;
              fVar221 = (auVar89._0_4_ + auVar87._0_4_) * 0.16666667;
              fVar167 = fVar167 * 0.16666667;
              auVar192._0_4_ = fVar167 * (float)local_580._0_4_;
              auVar192._4_4_ = fVar167 * (float)local_580._4_4_;
              auVar192._8_4_ = fVar167 * fStack_578;
              auVar192._12_4_ = fVar167 * fStack_574;
              auVar223._4_4_ = fVar221;
              auVar223._0_4_ = fVar221;
              auVar223._8_4_ = fVar221;
              auVar223._12_4_ = fVar221;
              auVar89 = vfmadd132ps_fma(auVar223,auVar192,local_540._0_16_);
              auVar193._4_4_ = fVar220;
              auVar193._0_4_ = fVar220;
              auVar193._8_4_ = fVar220;
              auVar193._12_4_ = fVar220;
              auVar89 = vfmadd132ps_fma(auVar193,auVar89,local_560._0_16_);
              auVar174._4_4_ = fVar244;
              auVar174._0_4_ = fVar244;
              auVar174._8_4_ = fVar244;
              auVar174._12_4_ = fVar244;
              auVar89 = vfmadd132ps_fma(auVar174,auVar89,local_520._0_16_);
              local_400._0_16_ = auVar89;
              auVar89 = vsubps_avx(auVar90,auVar89);
              local_7a0._0_16_ = auVar89;
              auVar89 = vdpps_avx(auVar89,auVar89,0x7f);
              local_5a0._0_16_ = auVar89;
              if (auVar89._0_4_ < 0.0) {
                local_660._0_4_ = fVar242;
                local_680._0_4_ = fVar243;
                auVar255._0_4_ = sqrtf(auVar89._0_4_);
                auVar255._4_60_ = extraout_var_00;
                auVar89 = auVar255._0_16_;
                fVar243 = (float)local_680._0_4_;
              }
              else {
                auVar89 = vsqrtss_avx(auVar89,auVar89);
                local_660._0_4_ = fVar242;
              }
              local_420._4_4_ = local_620._0_4_;
              local_420._0_4_ = local_420._4_4_;
              fStack_418 = (float)local_420._4_4_;
              fStack_414 = (float)local_420._4_4_;
              auVar94 = vfnmsub213ss_fma(local_900._0_16_,local_900._0_16_,
                                         ZEXT416((uint)(fVar243 * 4.0)));
              auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * 4.0)),local_620._0_16_,
                                        local_620._0_16_);
              fVar242 = (float)local_420._4_4_ * -(float)local_420._4_4_ * 0.5;
              fVar243 = auVar94._0_4_ * 0.5;
              fVar244 = auVar90._0_4_ * 0.5;
              local_660._0_4_ = (float)local_660._0_4_ * 0.5;
              auVar214._0_4_ = (float)local_660._0_4_ * (float)local_580._0_4_;
              auVar214._4_4_ = (float)local_660._0_4_ * (float)local_580._4_4_;
              auVar214._8_4_ = (float)local_660._0_4_ * fStack_578;
              auVar214._12_4_ = (float)local_660._0_4_ * fStack_574;
              auVar175._4_4_ = fVar244;
              auVar175._0_4_ = fVar244;
              auVar175._8_4_ = fVar244;
              auVar175._12_4_ = fVar244;
              auVar90 = vfmadd132ps_fma(auVar175,auVar214,local_540._0_16_);
              auVar194._4_4_ = fVar243;
              auVar194._0_4_ = fVar243;
              auVar194._8_4_ = fVar243;
              auVar194._12_4_ = fVar243;
              auVar90 = vfmadd132ps_fma(auVar194,auVar90,local_560._0_16_);
              auVar254._4_4_ = fVar242;
              auVar254._0_4_ = fVar242;
              auVar254._8_4_ = fVar242;
              auVar254._12_4_ = fVar242;
              local_660._0_16_ = vfmadd132ps_fma(auVar254,auVar90,local_520._0_16_);
              local_440._0_16_ = vdpps_avx(local_660._0_16_,local_660._0_16_,0x7f);
              auVar69._12_4_ = 0;
              auVar69._0_12_ = ZEXT812(0);
              fVar242 = local_440._0_4_;
              auVar94 = vrsqrt14ss_avx512f(auVar69 << 0x20,ZEXT416((uint)fVar242));
              local_8b0 = auVar94._0_4_ * 1.5;
              local_470 = vrcp14ss_avx512f(auVar69 << 0x20,ZEXT416((uint)fVar242));
              auVar90 = vfnmadd213ss_fma(local_470,local_440._0_16_,ZEXT416(0x40000000));
              local_680._0_4_ = auVar89._0_4_;
              if (fVar242 < -fVar242) {
                local_8a0 = auVar94;
                fVar243 = sqrtf(fVar242);
                auVar89 = ZEXT416((uint)local_680._0_4_);
                auVar94 = local_8a0;
                auVar93 = local_660._0_16_;
              }
              else {
                auVar93 = vsqrtss_avx(local_440._0_16_,local_440._0_16_);
                fVar243 = auVar93._0_4_;
                auVar93 = local_660._0_16_;
              }
              fVar244 = auVar94._0_4_;
              local_8b0 = local_8b0 + fVar242 * -0.5 * fVar244 * fVar244 * fVar244;
              fStack_8ac = local_8b0;
              fStack_8a8 = local_8b0;
              fStack_8a4 = local_8b0;
              auVar256._0_4_ = auVar93._0_4_ * local_8b0;
              auVar256._4_4_ = auVar93._4_4_ * local_8b0;
              auVar256._8_4_ = auVar93._8_4_ * local_8b0;
              auVar256._12_4_ = auVar93._12_4_ * local_8b0;
              auVar94 = vdpps_avx(local_7a0._0_16_,auVar256,0x7f);
              fVar244 = auVar89._0_4_;
              auVar153._0_4_ = auVar94._0_4_ * auVar94._0_4_;
              auVar153._4_4_ = auVar94._4_4_ * auVar94._4_4_;
              auVar153._8_4_ = auVar94._8_4_ * auVar94._8_4_;
              auVar153._12_4_ = auVar94._12_4_ * auVar94._12_4_;
              auVar87 = vsubps_avx(local_5a0._0_16_,auVar153);
              fVar242 = auVar87._0_4_;
              auVar176._4_12_ = ZEXT812(0) << 0x20;
              auVar176._0_4_ = fVar242;
              auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar176);
              auVar88 = vmulss_avx512f(auVar91,ZEXT416(0x3fc00000));
              local_8a0._0_4_ = fVar242 * -0.5;
              if (fVar242 < 0.0) {
                _local_4a0 = auVar256;
                local_490 = auVar91;
                local_480 = auVar94;
                fVar242 = sqrtf(fVar242);
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar89 = ZEXT416((uint)local_680._0_4_);
                auVar91 = local_490;
                auVar93 = local_660._0_16_;
                auVar94 = local_480;
                auVar256 = _local_4a0;
              }
              else {
                auVar87 = vsqrtss_avx(auVar87,auVar87);
                fVar242 = auVar87._0_4_;
              }
              auVar255 = ZEXT1664(auVar93);
              auVar252 = ZEXT1664(local_5a0._0_16_);
              auVar248 = ZEXT1664(local_7a0._0_16_);
              auVar265 = ZEXT3264(local_640);
              auVar263 = ZEXT3264(local_7e0);
              auVar257 = ZEXT3264(local_800);
              auVar258 = ZEXT3264(local_6a0);
              auVar259 = ZEXT3264(local_6c0);
              auVar260 = ZEXT3264(local_820);
              auVar261 = ZEXT3264(local_6e0);
              auVar262 = ZEXT3264(local_840);
              auVar264 = ZEXT3264(local_700);
              auVar266 = ZEXT3264(local_860);
              auVar267 = ZEXT3264(local_720);
              auVar268 = ZEXT3264(local_740);
              auVar269 = ZEXT3264(local_7c0);
              auVar270 = ZEXT3264(local_880);
              auVar246 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_620._0_16_,
                                         local_900._0_16_);
              auVar4 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                       local_620._0_16_);
              auVar87 = vshufps_avx(_local_500,_local_500,0x55);
              auVar195._0_4_ = auVar87._0_4_ * (float)local_580._0_4_;
              auVar195._4_4_ = auVar87._4_4_ * (float)local_580._4_4_;
              auVar195._8_4_ = auVar87._8_4_ * fStack_578;
              auVar195._12_4_ = auVar87._12_4_ * fStack_574;
              auVar215._0_4_ = auVar4._0_4_;
              auVar215._4_4_ = auVar215._0_4_;
              auVar215._8_4_ = auVar215._0_4_;
              auVar215._12_4_ = auVar215._0_4_;
              auVar87 = vfmadd132ps_fma(auVar215,auVar195,local_540._0_16_);
              auVar177._0_4_ = auVar246._0_4_;
              auVar177._4_4_ = auVar177._0_4_;
              auVar177._8_4_ = auVar177._0_4_;
              auVar177._12_4_ = auVar177._0_4_;
              auVar87 = vfmadd132ps_fma(auVar177,auVar87,local_560._0_16_);
              auVar87 = vfmadd132ps_fma(_local_420,auVar87,local_520._0_16_);
              auVar178._0_4_ = auVar87._0_4_ * (float)local_440._0_4_;
              auVar178._4_4_ = auVar87._4_4_ * (float)local_440._0_4_;
              auVar178._8_4_ = auVar87._8_4_ * (float)local_440._0_4_;
              auVar178._12_4_ = auVar87._12_4_ * (float)local_440._0_4_;
              auVar87 = vdpps_avx(auVar93,auVar87,0x7f);
              fVar220 = auVar87._0_4_;
              auVar196._0_4_ = auVar93._0_4_ * fVar220;
              auVar196._4_4_ = auVar93._4_4_ * fVar220;
              auVar196._8_4_ = auVar93._8_4_ * fVar220;
              auVar196._12_4_ = auVar93._12_4_ * fVar220;
              auVar87 = vsubps_avx(auVar178,auVar196);
              fVar220 = auVar90._0_4_ * (float)local_470._0_4_;
              auVar246 = vmaxss_avx(ZEXT416((uint)fVar207),
                                    ZEXT416((uint)(local_500._0_4_ * fVar144 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar92 = vxorps_avx512vl(auVar93,auVar26);
              auVar197._0_4_ = auVar87._0_4_ * fVar220 * local_8b0;
              auVar197._4_4_ = auVar87._4_4_ * fVar220 * fStack_8ac;
              auVar197._8_4_ = auVar87._8_4_ * fVar220 * fStack_8a8;
              auVar197._12_4_ = auVar87._12_4_ * fVar220 * fStack_8a4;
              auVar90 = vdpps_avx(auVar92,auVar256,0x7f);
              auVar87 = vfmadd213ss_fma(auVar89,ZEXT416((uint)fVar207),auVar246);
              auVar89 = vdpps_avx(local_7a0._0_16_,auVar197,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)(fVar244 + 1.0)),
                                       ZEXT416((uint)(fVar207 / fVar243)),auVar87);
              fVar243 = auVar90._0_4_ + auVar89._0_4_;
              auVar89 = vdpps_avx(local_4e0._0_16_,auVar256,0x7f);
              auVar90 = vdpps_avx(local_7a0._0_16_,auVar92,0x7f);
              fVar244 = auVar91._0_4_;
              auVar92 = vaddss_avx512f(auVar88,ZEXT416((uint)(fVar244 * (float)local_8a0._0_4_ *
                                                             fVar244 * fVar244)));
              auVar87 = vdpps_avx(local_7a0._0_16_,local_4e0._0_16_,0x7f);
              auVar88 = vfnmadd231ss_fma(auVar90,auVar94,ZEXT416((uint)fVar243));
              auVar87 = vfnmadd231ss_fma(auVar87,auVar94,auVar89);
              auVar90 = vpermilps_avx(local_400._0_16_,0xff);
              fVar242 = fVar242 - auVar90._0_4_;
              auVar91 = vshufps_avx(auVar93,auVar93,0xff);
              auVar90 = vfmsub213ss_fma(auVar88,auVar92,auVar91);
              auVar236._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
              auVar236._8_4_ = auVar90._8_4_ ^ 0x80000000;
              auVar236._12_4_ = auVar90._12_4_ ^ 0x80000000;
              auVar87 = ZEXT416((uint)(auVar87._0_4_ * auVar92._0_4_));
              auVar88 = vfmsub231ss_fma(ZEXT416((uint)(auVar89._0_4_ * auVar90._0_4_)),
                                        ZEXT416((uint)fVar243),auVar87);
              auVar90 = vinsertps_avx(auVar236,auVar87,0x1c);
              auVar229._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
              auVar229._8_4_ = auVar89._8_4_ ^ 0x80000000;
              auVar229._12_4_ = auVar89._12_4_ ^ 0x80000000;
              auVar87 = vinsertps_avx(ZEXT416((uint)fVar243),auVar229,0x10);
              auVar216._0_4_ = auVar88._0_4_;
              auVar216._4_4_ = auVar216._0_4_;
              auVar216._8_4_ = auVar216._0_4_;
              auVar216._12_4_ = auVar216._0_4_;
              auVar89 = vdivps_avx(auVar90,auVar216);
              auVar90 = vdivps_avx(auVar87,auVar216);
              fVar243 = auVar94._0_4_;
              auVar231 = ZEXT1664(CONCAT412(fVar242,CONCAT48(fVar242,CONCAT44(fVar242,fVar242))));
              auVar217._0_4_ = fVar243 * auVar89._0_4_ + fVar242 * auVar90._0_4_;
              auVar217._4_4_ = fVar243 * auVar89._4_4_ + fVar242 * auVar90._4_4_;
              auVar217._8_4_ = fVar243 * auVar89._8_4_ + fVar242 * auVar90._8_4_;
              auVar217._12_4_ = fVar243 * auVar89._12_4_ + fVar242 * auVar90._12_4_;
              auVar89 = vsubps_avx(_local_500,auVar217);
              auVar245 = ZEXT1664(auVar89);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar90 = vandps_avx512vl(auVar94,auVar27);
              if (auVar90._0_4_ < auVar4._0_4_) {
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(auVar4._0_4_ + auVar246._0_4_)),local_4b0,
                                          ZEXT416(0x36000000));
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar94 = vandps_avx512vl(ZEXT416((uint)fVar242),auVar28);
                if (auVar94._0_4_ < auVar90._0_4_) {
                  fVar144 = auVar89._0_4_ + (float)local_4c0._0_4_;
                  bVar76 = 0;
                  bVar77 = 0;
                  if (fVar144 < (ray->org).field_0.m128[3]) goto LAB_01ca361c;
                  auVar234 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  auVar239 = ZEXT3264(_local_8e0);
                  auVar241 = ZEXT3264(_local_5c0);
                  if (ray->tfar < fVar144) goto LAB_01ca3625;
                  auVar90 = vmovshdup_avx(auVar89);
                  bVar76 = 0;
                  fVar242 = auVar90._0_4_;
                  if ((fVar242 < 0.0) || (1.0 < fVar242)) goto LAB_01ca3625;
                  auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5a0._0_4_));
                  fVar244 = auVar90._0_4_;
                  fVar243 = local_5a0._0_4_ * -0.5;
                  auVar231 = ZEXT464((uint)fVar243);
                  pGVar6 = (local_910->scene->geometries).items[local_908].ptr;
                  if ((pGVar6->mask & ray->mask) == 0) {
                    bVar76 = 0;
                    goto LAB_01ca3625;
                  }
                  if ((local_910->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar76 = 1, pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01ca3625;
                  local_900._0_4_ = ray->tfar;
                  fVar243 = fVar244 * 1.5 + fVar243 * fVar244 * fVar244 * fVar244;
                  auVar218._0_4_ = local_7a0._0_4_ * fVar243;
                  auVar218._4_4_ = local_7a0._4_4_ * fVar243;
                  auVar218._8_4_ = local_7a0._8_4_ * fVar243;
                  auVar218._12_4_ = local_7a0._12_4_ * fVar243;
                  auVar91 = vfmadd213ps_fma(auVar91,auVar218,auVar93);
                  auVar90 = vshufps_avx(auVar218,auVar218,0xc9);
                  auVar94 = vshufps_avx(auVar93,auVar93,0xc9);
                  auVar219._0_4_ = auVar218._0_4_ * auVar94._0_4_;
                  auVar219._4_4_ = auVar218._4_4_ * auVar94._4_4_;
                  auVar219._8_4_ = auVar218._8_4_ * auVar94._8_4_;
                  auVar219._12_4_ = auVar218._12_4_ * auVar94._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar219,auVar93,auVar90);
                  auVar90 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar94 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar231 = ZEXT1664(auVar94);
                  auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                  auVar154._0_4_ = auVar91._0_4_ * auVar87._0_4_;
                  auVar154._4_4_ = auVar91._4_4_ * auVar87._4_4_;
                  auVar154._8_4_ = auVar91._8_4_ * auVar87._8_4_;
                  auVar154._12_4_ = auVar91._12_4_ * auVar87._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar154,auVar90,auVar94);
                  auVar90 = vshufps_avx(auVar87,auVar87,0xe9);
                  local_5f0 = vmovlps_avx(auVar90);
                  local_5e8 = auVar87._0_4_;
                  local_5e4 = fVar242;
                  local_5e0 = 0;
                  local_5dc = uVar1;
                  local_5d8 = (int)local_908;
                  local_5d4 = local_910->user->instID[0];
                  local_5d0 = local_910->user->instPrimID[0];
                  ray->tfar = fVar144;
                  local_918 = -1;
                  local_770.valid = &local_918;
                  local_770.geometryUserPtr = pGVar6->userPtr;
                  local_770.context = local_910->user;
                  local_770.ray = (RTCRayN *)ray;
                  local_770.hit = (RTCHitN *)&local_5f0;
                  local_770.N = 1;
                  if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01ca3832:
                    p_Var7 = local_910->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((local_910->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      auVar245 = ZEXT1664(auVar245._0_16_);
                      auVar248 = ZEXT1664(auVar248._0_16_);
                      auVar252 = ZEXT1664(auVar252._0_16_);
                      auVar255 = ZEXT1664(auVar255._0_16_);
                      (*p_Var7)(&local_770);
                      if (*local_770.valid == 0) goto LAB_01ca387f;
                    }
                    bVar77 = 1;
                  }
                  else {
                    auVar231 = ZEXT1664(auVar94);
                    auVar245 = ZEXT1664(auVar89);
                    auVar248 = ZEXT1664(local_7a0._0_16_);
                    auVar252 = ZEXT1664(local_5a0._0_16_);
                    auVar255 = ZEXT1664(auVar93);
                    (*pGVar6->occlusionFilterN)(&local_770);
                    if (*local_770.valid != 0) goto LAB_01ca3832;
LAB_01ca387f:
                    ray->tfar = (float)local_900._0_4_;
                    bVar77 = 0;
                  }
                  auVar265 = ZEXT3264(local_640);
                  auVar263 = ZEXT3264(local_7e0);
                  auVar257 = ZEXT3264(local_800);
                  auVar258 = ZEXT3264(local_6a0);
                  auVar259 = ZEXT3264(local_6c0);
                  auVar260 = ZEXT3264(local_820);
                  auVar261 = ZEXT3264(local_6e0);
                  auVar262 = ZEXT3264(local_840);
                  auVar264 = ZEXT3264(local_700);
                  auVar266 = ZEXT3264(local_860);
                  auVar267 = ZEXT3264(local_720);
                  auVar268 = ZEXT3264(local_740);
                  auVar269 = ZEXT3264(local_7c0);
                  auVar270 = ZEXT3264(local_880);
                  goto LAB_01ca361c;
                }
              }
              bVar84 = uVar85 < 4;
              uVar85 = uVar85 + 1;
            } while (uVar85 != 5);
            bVar84 = false;
            bVar77 = 5;
LAB_01ca361c:
            bVar76 = bVar77;
            auVar239 = ZEXT3264(_local_8e0);
            auVar234 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar241 = ZEXT3264(_local_5c0);
LAB_01ca3625:
            bVar83 = (bool)(bVar83 | bVar84 & bVar76);
            fVar144 = ray->tfar;
            auVar160._4_4_ = fVar144;
            auVar160._0_4_ = fVar144;
            auVar160._8_4_ = fVar144;
            auVar160._12_4_ = fVar144;
            auVar160._16_4_ = fVar144;
            auVar160._20_4_ = fVar144;
            auVar160._24_4_ = fVar144;
            auVar160._28_4_ = fVar144;
            auVar74._4_4_ = fStack_39c;
            auVar74._0_4_ = local_3a0;
            auVar74._8_4_ = fStack_398;
            auVar74._12_4_ = fStack_394;
            auVar74._16_4_ = fStack_390;
            auVar74._20_4_ = fStack_38c;
            auVar74._24_4_ = fStack_388;
            auVar74._28_4_ = fStack_384;
            uVar18 = vcmpps_avx512vl(auVar160,auVar74,0xd);
            bVar79 = ~('\x01' << ((byte)iVar22 & 0x1f)) & bVar79 & (byte)uVar18;
          } while (bVar79 != 0);
          auVar241 = ZEXT3264(local_320);
        }
        uVar20 = vpcmpgtd_avx512vl(local_3e0,local_360);
        uVar21 = vpcmpd_avx512vl(local_360,local_2a0,1);
        auVar201._0_4_ = auVar239._0_4_ + (float)local_2e0._0_4_;
        auVar201._4_4_ = auVar239._4_4_ + (float)local_2e0._4_4_;
        auVar201._8_4_ = auVar239._8_4_ + fStack_2d8;
        auVar201._12_4_ = auVar239._12_4_ + fStack_2d4;
        auVar201._16_4_ = auVar239._16_4_ + fStack_2d0;
        auVar201._20_4_ = auVar239._20_4_ + fStack_2cc;
        auVar201._24_4_ = auVar239._24_4_ + fStack_2c8;
        auVar201._28_4_ = auVar239._28_4_ + fStack_2c4;
        uVar18 = vcmpps_avx512vl(auVar201,auVar160,2);
        bVar79 = (byte)local_888 & (byte)uVar21 & (byte)uVar18;
        auVar202._0_4_ = auVar241._0_4_ + auVar239._0_4_;
        auVar202._4_4_ = auVar241._4_4_ + auVar239._4_4_;
        auVar202._8_4_ = auVar241._8_4_ + auVar239._8_4_;
        auVar202._12_4_ = auVar241._12_4_ + auVar239._12_4_;
        auVar202._16_4_ = auVar241._16_4_ + auVar239._16_4_;
        auVar202._20_4_ = auVar241._20_4_ + auVar239._20_4_;
        auVar202._24_4_ = auVar241._24_4_ + auVar239._24_4_;
        auVar202._28_4_ = auVar241._28_4_ + auVar239._28_4_;
        uVar18 = vcmpps_avx512vl(auVar202,auVar160,2);
        bVar75 = bVar75 & (byte)uVar20 & (byte)uVar18 | bVar79;
        pPVar82 = local_458;
        prim = local_450;
        if (bVar75 != 0) {
          abStack_180[uVar78 * 0x60] = bVar75;
          auVar136._0_4_ =
               (uint)(bVar79 & 1) * local_2e0._0_4_ |
               (uint)!(bool)(bVar79 & 1) * (int)auVar241._0_4_;
          bVar84 = (bool)(bVar79 >> 1 & 1);
          auVar136._4_4_ = (uint)bVar84 * local_2e0._4_4_ | (uint)!bVar84 * (int)auVar241._4_4_;
          bVar84 = (bool)(bVar79 >> 2 & 1);
          auVar136._8_4_ = (uint)bVar84 * (int)fStack_2d8 | (uint)!bVar84 * (int)auVar241._8_4_;
          bVar84 = (bool)(bVar79 >> 3 & 1);
          auVar136._12_4_ = (uint)bVar84 * (int)fStack_2d4 | (uint)!bVar84 * (int)auVar241._12_4_;
          bVar84 = (bool)(bVar79 >> 4 & 1);
          auVar136._16_4_ = (uint)bVar84 * (int)fStack_2d0 | (uint)!bVar84 * (int)auVar241._16_4_;
          bVar84 = (bool)(bVar79 >> 5 & 1);
          auVar136._20_4_ = (uint)bVar84 * (int)fStack_2cc | (uint)!bVar84 * (int)auVar241._20_4_;
          bVar84 = (bool)(bVar79 >> 6 & 1);
          auVar136._24_4_ = (uint)bVar84 * (int)fStack_2c8 | (uint)!bVar84 * (int)auVar241._24_4_;
          auVar136._28_4_ =
               (uint)(bVar79 >> 7) * (int)fStack_2c4 |
               (uint)!(bool)(bVar79 >> 7) * (int)auVar241._28_4_;
          auVar241 = ZEXT3264(auVar136);
          *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar136;
          uVar85 = vmovlps_avx(local_370);
          (&uStack_140)[uVar78 * 0xc] = uVar85;
          aiStack_138[uVar78 * 0x18] = local_884 + 1;
          uVar78 = (ulong)((int)uVar78 + 1);
        }
      }
    }
    fVar207 = ray->tfar;
    auVar156._4_4_ = fVar207;
    auVar156._0_4_ = fVar207;
    auVar156._8_4_ = fVar207;
    auVar156._12_4_ = fVar207;
    auVar156._16_4_ = fVar207;
    auVar156._20_4_ = fVar207;
    auVar156._24_4_ = fVar207;
    auVar156._28_4_ = fVar207;
    do {
      uVar86 = (uint)uVar78;
      uVar78 = (ulong)(uVar86 - 1);
      if (uVar86 == 0) {
        if (bVar83 != false) {
          return bVar83;
        }
        uVar18 = vcmpps_avx512vl(auVar156,local_280,0xd);
        uVar86 = (uint)local_448 & (uint)uVar18;
        local_448 = (ulong)uVar86;
        if (uVar86 == 0) {
          return false;
        }
        goto LAB_01ca1368;
      }
      lVar81 = uVar78 * 0x60;
      auVar100 = *(undefined1 (*) [32])(auStack_160 + lVar81);
      auVar199._0_4_ = auVar239._0_4_ + auVar100._0_4_;
      auVar199._4_4_ = auVar239._4_4_ + auVar100._4_4_;
      auVar199._8_4_ = auVar239._8_4_ + auVar100._8_4_;
      auVar199._12_4_ = auVar239._12_4_ + auVar100._12_4_;
      auVar199._16_4_ = auVar239._16_4_ + auVar100._16_4_;
      auVar199._20_4_ = auVar239._20_4_ + auVar100._20_4_;
      auVar199._24_4_ = auVar239._24_4_ + auVar100._24_4_;
      auVar199._28_4_ = auVar239._28_4_ + auVar100._28_4_;
      uVar18 = vcmpps_avx512vl(auVar199,auVar156,2);
      uVar137 = (uint)uVar18 & (uint)abStack_180[lVar81];
    } while (uVar137 == 0);
    uVar85 = (&uStack_140)[uVar78 * 0xc];
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar85;
    auVar200._8_4_ = 0x7f800000;
    auVar200._0_8_ = 0x7f8000007f800000;
    auVar200._12_4_ = 0x7f800000;
    auVar200._16_4_ = 0x7f800000;
    auVar200._20_4_ = 0x7f800000;
    auVar200._24_4_ = 0x7f800000;
    auVar200._28_4_ = 0x7f800000;
    auVar98 = vblendmps_avx512vl(auVar200,auVar100);
    bVar75 = (byte)uVar137;
    auVar133._0_4_ =
         (uint)(bVar75 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar75 & 1) * (int)auVar100._0_4_;
    bVar84 = (bool)((byte)(uVar137 >> 1) & 1);
    auVar133._4_4_ = (uint)bVar84 * auVar98._4_4_ | (uint)!bVar84 * (int)auVar100._4_4_;
    bVar84 = (bool)((byte)(uVar137 >> 2) & 1);
    auVar133._8_4_ = (uint)bVar84 * auVar98._8_4_ | (uint)!bVar84 * (int)auVar100._8_4_;
    bVar84 = (bool)((byte)(uVar137 >> 3) & 1);
    auVar133._12_4_ = (uint)bVar84 * auVar98._12_4_ | (uint)!bVar84 * (int)auVar100._12_4_;
    bVar84 = (bool)((byte)(uVar137 >> 4) & 1);
    auVar133._16_4_ = (uint)bVar84 * auVar98._16_4_ | (uint)!bVar84 * (int)auVar100._16_4_;
    bVar84 = (bool)((byte)(uVar137 >> 5) & 1);
    auVar133._20_4_ = (uint)bVar84 * auVar98._20_4_ | (uint)!bVar84 * (int)auVar100._20_4_;
    bVar84 = (bool)((byte)(uVar137 >> 6) & 1);
    auVar133._24_4_ = (uint)bVar84 * auVar98._24_4_ | (uint)!bVar84 * (int)auVar100._24_4_;
    auVar133._28_4_ =
         (uVar137 >> 7) * auVar98._28_4_ | (uint)!SUB41(uVar137 >> 7,0) * (int)auVar100._28_4_;
    auVar100 = vshufps_avx(auVar133,auVar133,0xb1);
    auVar100 = vminps_avx(auVar133,auVar100);
    auVar98 = vshufpd_avx(auVar100,auVar100,5);
    auVar100 = vminps_avx(auVar100,auVar98);
    auVar98 = vpermpd_avx2(auVar100,0x4e);
    auVar100 = vminps_avx(auVar100,auVar98);
    uVar18 = vcmpps_avx512vl(auVar133,auVar100,0);
    bVar79 = (byte)uVar18 & bVar75;
    if (bVar79 != 0) {
      uVar137 = (uint)bVar79;
    }
    uVar138 = 0;
    for (; (uVar137 & 1) == 0; uVar137 = uVar137 >> 1 | 0x80000000) {
      uVar138 = uVar138 + 1;
    }
    local_884 = aiStack_138[uVar78 * 0x18];
    bVar75 = ~('\x01' << ((byte)uVar138 & 0x1f)) & bVar75;
    abStack_180[lVar81] = bVar75;
    if (bVar75 == 0) {
      uVar86 = uVar86 - 1;
    }
    uVar146 = (undefined4)uVar85;
    auVar179._4_4_ = uVar146;
    auVar179._0_4_ = uVar146;
    auVar179._8_4_ = uVar146;
    auVar179._12_4_ = uVar146;
    auVar179._16_4_ = uVar146;
    auVar179._20_4_ = uVar146;
    auVar179._24_4_ = uVar146;
    auVar179._28_4_ = uVar146;
    auVar89 = vmovshdup_avx(auVar148);
    auVar89 = vsubps_avx(auVar89,auVar148);
    auVar157._0_4_ = auVar89._0_4_;
    auVar157._4_4_ = auVar157._0_4_;
    auVar157._8_4_ = auVar157._0_4_;
    auVar157._12_4_ = auVar157._0_4_;
    auVar157._16_4_ = auVar157._0_4_;
    auVar157._20_4_ = auVar157._0_4_;
    auVar157._24_4_ = auVar157._0_4_;
    auVar157._28_4_ = auVar157._0_4_;
    auVar89 = vfmadd132ps_fma(auVar157,auVar179,_DAT_01faff20);
    _local_2e0 = ZEXT1632(auVar89);
    local_370._8_8_ = 0;
    local_370._0_8_ = *(ulong *)(local_2e0 + (ulong)uVar138 * 4);
    uVar78 = (ulong)uVar86;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }